

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

void embree::avx2::CurveNiIntersectorK<4,4>::
     intersect_h<embree::avx2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,8>,embree::avx2::Intersect1KEpilogMU<8,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 (*pauVar1) [32];
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  int iVar6;
  RTCFilterFunctionN p_Var7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [28];
  uint uVar64;
  uint uVar65;
  ulong uVar66;
  long lVar67;
  uint uVar68;
  ulong uVar69;
  long lVar70;
  Geometry *pGVar71;
  undefined4 uVar72;
  undefined8 unaff_R13;
  long lVar73;
  undefined8 uVar74;
  float fVar95;
  vint4 bi_2;
  undefined1 auVar75 [16];
  float fVar94;
  float fVar96;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar98;
  float fVar99;
  float fVar100;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  float fVar97;
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar81 [16];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  vint4 bi_1;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [64];
  float fVar120;
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [32];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  vint4 ai_2;
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  vint4 ai;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [64];
  vint4 bi;
  undefined1 auVar156 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [32];
  undefined1 auVar165 [64];
  vint4 ai_1;
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [32];
  undefined1 auVar179 [64];
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar192 [64];
  undefined1 auVar196 [16];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined4 uVar200;
  undefined1 auVar201 [16];
  undefined1 auVar202 [64];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  undefined1 auVar205 [32];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined8 uVar214;
  undefined8 uVar215;
  undefined8 uVar216;
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_840 [32];
  undefined1 local_820 [16];
  undefined1 auStack_810 [16];
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined1 local_7a0 [16];
  Precalculations *local_790;
  ulong local_788;
  undefined1 local_780 [32];
  undefined1 local_760 [48];
  undefined1 local_730 [8];
  undefined8 uStack_728;
  undefined1 local_720 [16];
  RTCFilterFunctionNArguments local_710;
  undefined1 local_6e0 [32];
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined1 (*local_670) [16];
  ulong local_668;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [16];
  undefined1 local_610 [8];
  uint uStack_608;
  uint uStack_604;
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  LinearSpace3fa *local_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [16];
  undefined4 local_430;
  undefined4 uStack_42c;
  undefined4 uStack_428;
  undefined4 uStack_424;
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 local_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined1 local_3d0 [16];
  uint local_3c0;
  uint uStack_3bc;
  uint uStack_3b8;
  uint uStack_3b4;
  uint uStack_3b0;
  uint uStack_3ac;
  uint uStack_3a8;
  uint uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined4 uStack_304;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [16];
  undefined1 local_230 [16];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  int local_1c0;
  int local_1bc;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  float local_140 [4];
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined1 local_100 [32];
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  float fStack_c4;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined4 uStack_a4;
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  
  PVar5 = prim[1];
  uVar66 = (ulong)(byte)PVar5;
  fVar120 = *(float *)(prim + uVar66 * 0x19 + 0x12);
  auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar140 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar138 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar138 = vinsertps_avx(auVar138,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar140 = vsubps_avx(auVar140,*(undefined1 (*) [16])(prim + uVar66 * 0x19 + 6));
  auVar75._0_4_ = fVar120 * auVar140._0_4_;
  auVar75._4_4_ = fVar120 * auVar140._4_4_;
  auVar75._8_4_ = fVar120 * auVar140._8_4_;
  auVar75._12_4_ = fVar120 * auVar140._12_4_;
  auVar151._0_4_ = fVar120 * auVar138._0_4_;
  auVar151._4_4_ = fVar120 * auVar138._4_4_;
  auVar151._8_4_ = fVar120 * auVar138._8_4_;
  auVar151._12_4_ = fVar120 * auVar138._12_4_;
  auVar140 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 4 + 6)));
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar138 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 5 + 6)));
  auVar138 = vcvtdq2ps_avx(auVar138);
  auVar139 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 6 + 6)));
  auVar139 = vcvtdq2ps_avx(auVar139);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xc + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0xd + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar78 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x12 + 6)));
  auVar78 = vcvtdq2ps_avx(auVar78);
  auVar77 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x13 + 6)));
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar121 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar66 * 0x14 + 6)));
  auVar121 = vcvtdq2ps_avx(auVar121);
  auVar206._4_4_ = auVar151._0_4_;
  auVar206._0_4_ = auVar151._0_4_;
  auVar206._8_4_ = auVar151._0_4_;
  auVar206._12_4_ = auVar151._0_4_;
  auVar102 = vshufps_avx(auVar151,auVar151,0x55);
  auVar76 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar120 = auVar76._0_4_;
  auVar196._0_4_ = fVar120 * auVar139._0_4_;
  fVar94 = auVar76._4_4_;
  auVar196._4_4_ = fVar94 * auVar139._4_4_;
  fVar95 = auVar76._8_4_;
  auVar196._8_4_ = fVar95 * auVar139._8_4_;
  fVar96 = auVar76._12_4_;
  auVar196._12_4_ = fVar96 * auVar139._12_4_;
  auVar186._0_4_ = auVar10._0_4_ * fVar120;
  auVar186._4_4_ = auVar10._4_4_ * fVar94;
  auVar186._8_4_ = auVar10._8_4_ * fVar95;
  auVar186._12_4_ = auVar10._12_4_ * fVar96;
  auVar173._0_4_ = auVar121._0_4_ * fVar120;
  auVar173._4_4_ = auVar121._4_4_ * fVar94;
  auVar173._8_4_ = auVar121._8_4_ * fVar95;
  auVar173._12_4_ = auVar121._12_4_ * fVar96;
  auVar76 = vfmadd231ps_fma(auVar196,auVar102,auVar138);
  auVar103 = vfmadd231ps_fma(auVar186,auVar102,auVar9);
  auVar102 = vfmadd231ps_fma(auVar173,auVar77,auVar102);
  auVar134 = vfmadd231ps_fma(auVar76,auVar206,auVar140);
  auVar103 = vfmadd231ps_fma(auVar103,auVar206,auVar8);
  auVar145 = vfmadd231ps_fma(auVar102,auVar78,auVar206);
  auVar207._4_4_ = auVar75._0_4_;
  auVar207._0_4_ = auVar75._0_4_;
  auVar207._8_4_ = auVar75._0_4_;
  auVar207._12_4_ = auVar75._0_4_;
  auVar102 = vshufps_avx(auVar75,auVar75,0x55);
  auVar76 = vshufps_avx(auVar75,auVar75,0xaa);
  fVar120 = auVar76._0_4_;
  auVar152._0_4_ = fVar120 * auVar139._0_4_;
  fVar94 = auVar76._4_4_;
  auVar152._4_4_ = fVar94 * auVar139._4_4_;
  fVar95 = auVar76._8_4_;
  auVar152._8_4_ = fVar95 * auVar139._8_4_;
  fVar96 = auVar76._12_4_;
  auVar152._12_4_ = fVar96 * auVar139._12_4_;
  auVar101._0_4_ = auVar10._0_4_ * fVar120;
  auVar101._4_4_ = auVar10._4_4_ * fVar94;
  auVar101._8_4_ = auVar10._8_4_ * fVar95;
  auVar101._12_4_ = auVar10._12_4_ * fVar96;
  auVar76._0_4_ = auVar121._0_4_ * fVar120;
  auVar76._4_4_ = auVar121._4_4_ * fVar94;
  auVar76._8_4_ = auVar121._8_4_ * fVar95;
  auVar76._12_4_ = auVar121._12_4_ * fVar96;
  auVar138 = vfmadd231ps_fma(auVar152,auVar102,auVar138);
  auVar139 = vfmadd231ps_fma(auVar101,auVar102,auVar9);
  auVar9 = vfmadd231ps_fma(auVar76,auVar102,auVar77);
  auVar10 = vfmadd231ps_fma(auVar138,auVar207,auVar140);
  auVar77 = vfmadd231ps_fma(auVar139,auVar207,auVar8);
  local_230._8_4_ = 0x7fffffff;
  local_230._0_8_ = 0x7fffffff7fffffff;
  local_230._12_4_ = 0x7fffffff;
  auVar121 = vfmadd231ps_fma(auVar9,auVar207,auVar78);
  auVar140 = vandps_avx(auVar134,local_230);
  auVar144._8_4_ = 0x219392ef;
  auVar144._0_8_ = 0x219392ef219392ef;
  auVar144._12_4_ = 0x219392ef;
  auVar140 = vcmpps_avx(auVar140,auVar144,1);
  auVar138 = vblendvps_avx(auVar134,auVar144,auVar140);
  auVar140 = vandps_avx(auVar103,local_230);
  auVar140 = vcmpps_avx(auVar140,auVar144,1);
  auVar139 = vblendvps_avx(auVar103,auVar144,auVar140);
  auVar140 = vandps_avx(local_230,auVar145);
  auVar140 = vcmpps_avx(auVar140,auVar144,1);
  auVar140 = vblendvps_avx(auVar145,auVar144,auVar140);
  auVar8 = vrcpps_avx(auVar138);
  auVar174._8_4_ = 0x3f800000;
  auVar174._0_8_ = 0x3f8000003f800000;
  auVar174._12_4_ = 0x3f800000;
  auVar138 = vfnmadd213ps_fma(auVar138,auVar8,auVar174);
  auVar8 = vfmadd132ps_fma(auVar138,auVar8,auVar8);
  auVar138 = vrcpps_avx(auVar139);
  auVar139 = vfnmadd213ps_fma(auVar139,auVar138,auVar174);
  auVar9 = vfmadd132ps_fma(auVar139,auVar138,auVar138);
  auVar138 = vrcpps_avx(auVar140);
  auVar140 = vfnmadd213ps_fma(auVar140,auVar138,auVar174);
  auVar78 = vfmadd132ps_fma(auVar140,auVar138,auVar138);
  auVar140._8_8_ = 0;
  auVar140._0_8_ = *(ulong *)(prim + uVar66 * 7 + 6);
  auVar140 = vpmovsxwd_avx(auVar140);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar139 = vsubps_avx(auVar140,auVar10);
  auVar138._8_8_ = 0;
  auVar138._0_8_ = *(ulong *)(prim + uVar66 * 9 + 6);
  auVar140 = vpmovsxwd_avx(auVar138);
  auVar145._0_4_ = auVar8._0_4_ * auVar139._0_4_;
  auVar145._4_4_ = auVar8._4_4_ * auVar139._4_4_;
  auVar145._8_4_ = auVar8._8_4_ * auVar139._8_4_;
  auVar145._12_4_ = auVar8._12_4_ * auVar139._12_4_;
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar140 = vsubps_avx(auVar140,auVar10);
  auVar153._0_4_ = auVar8._0_4_ * auVar140._0_4_;
  auVar153._4_4_ = auVar8._4_4_ * auVar140._4_4_;
  auVar153._8_4_ = auVar8._8_4_ * auVar140._8_4_;
  auVar153._12_4_ = auVar8._12_4_ * auVar140._12_4_;
  auVar139._8_8_ = 0;
  auVar139._0_8_ = *(ulong *)(prim + uVar66 * 0xe + 6);
  auVar140 = vpmovsxwd_avx(auVar139);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar138 = vsubps_avx(auVar140,auVar77);
  auVar103._1_3_ = 0;
  auVar103[0] = PVar5;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar140 = vpmovsxwd_avx(auVar8);
  auVar166._0_4_ = auVar9._0_4_ * auVar138._0_4_;
  auVar166._4_4_ = auVar9._4_4_ * auVar138._4_4_;
  auVar166._8_4_ = auVar9._8_4_ * auVar138._8_4_;
  auVar166._12_4_ = auVar9._12_4_ * auVar138._12_4_;
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar140 = vsubps_avx(auVar140,auVar77);
  auVar102._0_4_ = auVar9._0_4_ * auVar140._0_4_;
  auVar102._4_4_ = auVar9._4_4_ * auVar140._4_4_;
  auVar102._8_4_ = auVar9._8_4_ * auVar140._8_4_;
  auVar102._12_4_ = auVar9._12_4_ * auVar140._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar66 * 0x15 + 6);
  auVar140 = vpmovsxwd_avx(auVar9);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar140 = vsubps_avx(auVar140,auVar121);
  auVar134._0_4_ = auVar78._0_4_ * auVar140._0_4_;
  auVar134._4_4_ = auVar78._4_4_ * auVar140._4_4_;
  auVar134._8_4_ = auVar78._8_4_ * auVar140._8_4_;
  auVar134._12_4_ = auVar78._12_4_ * auVar140._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar66 * 0x17 + 6);
  auVar140 = vpmovsxwd_avx(auVar10);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar140 = vsubps_avx(auVar140,auVar121);
  auVar77._0_4_ = auVar78._0_4_ * auVar140._0_4_;
  auVar77._4_4_ = auVar78._4_4_ * auVar140._4_4_;
  auVar77._8_4_ = auVar78._8_4_ * auVar140._8_4_;
  auVar77._12_4_ = auVar78._12_4_ * auVar140._12_4_;
  auVar140 = vpminsd_avx(auVar145,auVar153);
  auVar138 = vpminsd_avx(auVar166,auVar102);
  auVar140 = vmaxps_avx(auVar140,auVar138);
  auVar138 = vpminsd_avx(auVar134,auVar77);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar187._4_4_ = uVar72;
  auVar187._0_4_ = uVar72;
  auVar187._8_4_ = uVar72;
  auVar187._12_4_ = uVar72;
  auVar138 = vmaxps_avx(auVar138,auVar187);
  auVar140 = vmaxps_avx(auVar140,auVar138);
  local_240._0_4_ = auVar140._0_4_ * 0.99999964;
  local_240._4_4_ = auVar140._4_4_ * 0.99999964;
  local_240._8_4_ = auVar140._8_4_ * 0.99999964;
  local_240._12_4_ = auVar140._12_4_ * 0.99999964;
  auVar140 = vpmaxsd_avx(auVar145,auVar153);
  auVar138 = vpmaxsd_avx(auVar166,auVar102);
  auVar140 = vminps_avx(auVar140,auVar138);
  auVar138 = vpmaxsd_avx(auVar134,auVar77);
  uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar121._4_4_ = uVar72;
  auVar121._0_4_ = uVar72;
  auVar121._8_4_ = uVar72;
  auVar121._12_4_ = uVar72;
  auVar138 = vminps_avx(auVar138,auVar121);
  auVar140 = vminps_avx(auVar140,auVar138);
  auVar78._0_4_ = auVar140._0_4_ * 1.0000004;
  auVar78._4_4_ = auVar140._4_4_ * 1.0000004;
  auVar78._8_4_ = auVar140._8_4_ * 1.0000004;
  auVar78._12_4_ = auVar140._12_4_ * 1.0000004;
  auVar103[4] = PVar5;
  auVar103._5_3_ = 0;
  auVar103[8] = PVar5;
  auVar103._9_3_ = 0;
  auVar103[0xc] = PVar5;
  auVar103._13_3_ = 0;
  auVar138 = vpcmpgtd_avx(auVar103,_DAT_01f4ad30);
  auVar140 = vcmpps_avx(local_240,auVar78,2);
  auVar140 = vandps_avx(auVar140,auVar138);
  uVar72 = vmovmskps_avx(auVar140);
  uVar66 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar72);
  local_4e8 = pre->ray_space + k;
  local_4e0 = mm_lookupmask_ps._16_8_;
  uStack_4d8 = mm_lookupmask_ps._24_8_;
  uStack_4d0 = mm_lookupmask_ps._16_8_;
  uStack_4c8 = mm_lookupmask_ps._24_8_;
  local_670 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_790 = pre;
  do {
    if (uVar66 == 0) {
      return;
    }
    lVar73 = 0;
    for (uVar69 = uVar66; (uVar69 & 1) == 0; uVar69 = uVar69 >> 1 | 0x8000000000000000) {
      lVar73 = lVar73 + 1;
    }
    local_560._4_4_ = *(undefined4 *)(prim + 2);
    local_788 = (ulong)(uint)local_560._4_4_;
    uVar65 = *(uint *)(prim + lVar73 * 4 + 6);
    local_668 = (ulong)uVar65;
    pGVar71 = (context->scene->geometries).items[local_788].ptr;
    uVar69 = (ulong)*(uint *)(*(long *)&pGVar71->field_0x58 +
                             local_668 *
                             pGVar71[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>
                             ._M_i);
    lVar70 = (long)pGVar71[1].intersectionFilterN * uVar69;
    lVar67 = (long)pGVar71[1].intersectionFilterN * (uVar69 + 1);
    lVar73 = *(long *)&pGVar71[1].time_range.upper;
    local_720 = *(undefined1 (*) [16])(lVar73 + lVar70);
    _local_730 = *(undefined1 (*) [16])(lVar73 + lVar67);
    uVar72 = *(undefined4 *)(lVar73 + 0xc + lVar70);
    auVar175._4_4_ = uVar72;
    auVar175._0_4_ = uVar72;
    auVar175._8_4_ = uVar72;
    auVar175._12_4_ = uVar72;
    local_a0._16_4_ = uVar72;
    local_a0._0_16_ = auVar175;
    local_a0._20_4_ = uVar72;
    local_a0._24_4_ = uVar72;
    local_a0._28_4_ = uVar72;
    iVar6 = (int)pGVar71[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    auVar140 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                             0x1c);
    auVar140 = vinsertps_avx(auVar140,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
    auVar79._8_4_ = 0xbeaaaaab;
    auVar79._0_8_ = 0xbeaaaaabbeaaaaab;
    auVar79._12_4_ = 0xbeaaaaab;
    auVar76 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                                (pGVar71[2].intersectionFilterN +
                                uVar69 * (long)pGVar71[2].pointQueryFunc),local_720,auVar79);
    auVar10 = vfmadd132ps_fma(*(undefined1 (*) [16])
                               (pGVar71[2].intersectionFilterN +
                               (long)pGVar71[2].pointQueryFunc * (uVar69 + 1)),_local_730,auVar79);
    auVar139 = vsubps_avx(local_720,auVar140);
    uVar72 = auVar139._0_4_;
    auVar135._4_4_ = uVar72;
    auVar135._0_4_ = uVar72;
    auVar135._8_4_ = uVar72;
    auVar135._12_4_ = uVar72;
    auVar138 = vshufps_avx(auVar139,auVar139,0x55);
    auVar139 = vshufps_avx(auVar139,auVar139,0xaa);
    aVar3 = (local_4e8->vx).field_0;
    aVar4 = (local_4e8->vy).field_0;
    fVar120 = (local_4e8->vz).field_0.m128[0];
    fVar94 = *(float *)((long)&(local_4e8->vz).field_0 + 4);
    fVar95 = *(float *)((long)&(local_4e8->vz).field_0 + 8);
    fVar96 = *(float *)((long)&(local_4e8->vz).field_0 + 0xc);
    auVar154._0_4_ = fVar120 * auVar139._0_4_;
    auVar154._4_4_ = fVar94 * auVar139._4_4_;
    auVar154._8_4_ = fVar95 * auVar139._8_4_;
    auVar154._12_4_ = fVar96 * auVar139._12_4_;
    auVar138 = vfmadd231ps_fma(auVar154,(undefined1  [16])aVar4,auVar138);
    auVar78 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar3,auVar135);
    auVar8 = vinsertps_avx(auVar78,auVar175,0x30);
    auVar139 = vsubps_avx(auVar76,auVar140);
    uVar72 = auVar139._0_4_;
    auVar155._4_4_ = uVar72;
    auVar155._0_4_ = uVar72;
    auVar155._8_4_ = uVar72;
    auVar155._12_4_ = uVar72;
    auVar138 = vshufps_avx(auVar139,auVar139,0x55);
    auVar139 = vshufps_avx(auVar139,auVar139,0xaa);
    auVar188._0_4_ = fVar120 * auVar139._0_4_;
    auVar188._4_4_ = fVar94 * auVar139._4_4_;
    auVar188._8_4_ = fVar95 * auVar139._8_4_;
    auVar188._12_4_ = fVar96 * auVar139._12_4_;
    auVar138 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar4,auVar138);
    auVar77 = vfmadd231ps_fma(auVar138,(undefined1  [16])aVar3,auVar155);
    auVar138 = vblendps_avx(auVar77,auVar76,8);
    auVar9 = vsubps_avx(auVar10,auVar140);
    uVar72 = auVar9._0_4_;
    auVar176._4_4_ = uVar72;
    auVar176._0_4_ = uVar72;
    auVar176._8_4_ = uVar72;
    auVar176._12_4_ = uVar72;
    auVar139 = vshufps_avx(auVar9,auVar9,0x55);
    auVar9 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar201._0_4_ = fVar120 * auVar9._0_4_;
    auVar201._4_4_ = fVar94 * auVar9._4_4_;
    auVar201._8_4_ = fVar95 * auVar9._8_4_;
    auVar201._12_4_ = fVar96 * auVar9._12_4_;
    auVar139 = vfmadd231ps_fma(auVar201,(undefined1  [16])aVar4,auVar139);
    auVar121 = vfmadd231ps_fma(auVar139,(undefined1  [16])aVar3,auVar176);
    auVar139 = vblendps_avx(auVar121,auVar10,8);
    auVar9 = vsubps_avx(_local_730,auVar140);
    auVar140 = vshufps_avx(auVar9,auVar9,0xaa);
    auVar177._0_4_ = fVar120 * auVar140._0_4_;
    auVar177._4_4_ = fVar94 * auVar140._4_4_;
    auVar177._8_4_ = fVar95 * auVar140._8_4_;
    auVar177._12_4_ = fVar96 * auVar140._12_4_;
    uVar72 = auVar9._0_4_;
    auVar167._4_4_ = uVar72;
    auVar167._0_4_ = uVar72;
    auVar167._8_4_ = uVar72;
    auVar167._12_4_ = uVar72;
    auVar140 = vshufps_avx(auVar9,auVar9,0x55);
    auVar140 = vfmadd231ps_fma(auVar177,(undefined1  [16])aVar4,auVar140);
    auVar102 = vfmadd231ps_fma(auVar140,(undefined1  [16])aVar3,auVar167);
    fVar120 = *(float *)(lVar73 + 0xc + lVar67);
    auVar80._4_4_ = fVar120;
    auVar80._0_4_ = fVar120;
    auVar80._8_4_ = fVar120;
    auVar80._12_4_ = fVar120;
    fStack_b0 = fVar120;
    _local_c0 = auVar80;
    fStack_ac = fVar120;
    fStack_a8 = fVar120;
    uStack_a4 = fVar120;
    auVar9 = vinsertps_avx(auVar102,auVar80,0x30);
    auVar140 = vandps_avx(auVar8,local_230);
    auVar138 = vandps_avx(auVar138,local_230);
    auVar8 = vmaxps_avx(auVar140,auVar138);
    auVar140 = vandps_avx(auVar139,local_230);
    auVar138 = vandps_avx(auVar9,local_230);
    auVar140 = vmaxps_avx(auVar140,auVar138);
    auVar140 = vmaxps_avx(auVar8,auVar140);
    auVar138 = vmovshdup_avx(auVar140);
    auVar138 = vmaxss_avx(auVar138,auVar140);
    auVar140 = vshufpd_avx(auVar140,auVar140,1);
    auVar140 = vmaxss_avx(auVar140,auVar138);
    lVar73 = (long)iVar6 * 0x44;
    auVar138 = vmovshdup_avx(auVar78);
    uVar74 = auVar138._0_8_;
    local_480._8_8_ = uVar74;
    local_480._0_8_ = uVar74;
    local_480._16_8_ = uVar74;
    local_480._24_8_ = uVar74;
    auVar138 = vmovshdup_avx(auVar77);
    uVar74 = auVar138._0_8_;
    local_460._8_8_ = uVar74;
    local_460._0_8_ = uVar74;
    local_460._16_8_ = uVar74;
    local_460._24_8_ = uVar74;
    _local_300 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x908);
    auVar138 = vmovshdup_avx(auVar121);
    uVar74 = auVar138._0_8_;
    local_540._8_8_ = uVar74;
    local_540._0_8_ = uVar74;
    local_540._16_8_ = uVar74;
    local_540._24_8_ = uVar74;
    auVar138 = vmovshdup_avx(auVar102);
    local_5c0 = auVar138._0_8_;
    uVar200 = auVar121._0_4_;
    local_260._4_4_ = uVar200;
    local_260._0_4_ = uVar200;
    local_260._8_4_ = uVar200;
    local_260._12_4_ = uVar200;
    local_260._16_4_ = uVar200;
    local_260._20_4_ = uVar200;
    local_260._24_4_ = uVar200;
    local_260._28_4_ = uVar200;
    local_320 = *(float *)(bezier_basis0 + lVar73 + 0xd8c);
    fStack_31c = *(float *)(bezier_basis0 + lVar73 + 0xd90);
    fStack_318 = *(float *)(bezier_basis0 + lVar73 + 0xd94);
    fStack_314 = *(float *)(bezier_basis0 + lVar73 + 0xd98);
    fStack_310 = *(float *)(bezier_basis0 + lVar73 + 0xd9c);
    fStack_30c = *(float *)(bezier_basis0 + lVar73 + 0xda0);
    fStack_308 = *(float *)(bezier_basis0 + lVar73 + 0xda4);
    local_5e0 = auVar102._0_4_;
    auVar106._0_4_ = local_320 * local_5e0;
    auVar106._4_4_ = fStack_31c * local_5e0;
    auVar106._8_4_ = fStack_318 * local_5e0;
    auVar106._12_4_ = fStack_314 * local_5e0;
    auVar106._16_4_ = fStack_310 * local_5e0;
    auVar106._20_4_ = fStack_30c * local_5e0;
    auVar106._24_4_ = fStack_308 * local_5e0;
    auVar106._28_4_ = 0;
    auVar139 = vfmadd231ps_fma(auVar106,_local_300,local_260);
    fVar94 = auVar138._0_4_;
    auVar160._0_4_ = local_320 * fVar94;
    fVar95 = auVar138._4_4_;
    auVar160._4_4_ = fStack_31c * fVar95;
    auVar160._8_4_ = fStack_318 * fVar94;
    auVar160._12_4_ = fStack_314 * fVar95;
    auVar160._16_4_ = fStack_310 * fVar94;
    auVar160._20_4_ = fStack_30c * fVar95;
    auVar160._24_4_ = fStack_308 * fVar94;
    auVar160._28_4_ = 0;
    auVar138 = vfmadd231ps_fma(auVar160,_local_300,local_540);
    auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x484);
    uVar72 = auVar77._0_4_;
    local_6a0._4_4_ = uVar72;
    local_6a0._0_4_ = uVar72;
    local_6a0._8_4_ = uVar72;
    local_6a0._12_4_ = uVar72;
    local_6a0._16_4_ = uVar72;
    local_6a0._20_4_ = uVar72;
    local_6a0._24_4_ = uVar72;
    local_6a0._28_4_ = uVar72;
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar106,local_6a0);
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar106,local_460);
    auVar160 = *(undefined1 (*) [32])(bezier_basis0 + lVar73);
    uVar72 = auVar78._0_4_;
    local_780._4_4_ = uVar72;
    local_780._0_4_ = uVar72;
    local_780._8_4_ = uVar72;
    local_780._12_4_ = uVar72;
    local_780._16_4_ = uVar72;
    local_780._20_4_ = uVar72;
    local_780._24_4_ = uVar72;
    local_780._28_4_ = uVar72;
    auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar160,local_780);
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar160,local_480);
    auVar164 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x908);
    fVar97 = *(float *)(bezier_basis1 + lVar73 + 0xd8c);
    fVar98 = *(float *)(bezier_basis1 + lVar73 + 0xd90);
    fVar99 = *(float *)(bezier_basis1 + lVar73 + 0xd94);
    fVar100 = *(float *)(bezier_basis1 + lVar73 + 0xd98);
    fVar183 = *(float *)(bezier_basis1 + lVar73 + 0xd9c);
    fVar184 = *(float *)(bezier_basis1 + lVar73 + 0xda0);
    fVar185 = *(float *)(bezier_basis1 + lVar73 + 0xda4);
    auVar132._4_4_ = local_5e0 * fVar98;
    auVar132._0_4_ = local_5e0 * fVar97;
    auVar132._8_4_ = local_5e0 * fVar99;
    auVar132._12_4_ = local_5e0 * fVar100;
    auVar132._16_4_ = local_5e0 * fVar183;
    auVar132._20_4_ = local_5e0 * fVar184;
    auVar132._24_4_ = local_5e0 * fVar185;
    auVar132._28_4_ = local_5e0;
    auVar8 = vfmadd231ps_fma(auVar132,auVar164,local_260);
    auVar170._4_4_ = fVar95 * fVar98;
    auVar170._0_4_ = fVar94 * fVar97;
    auVar170._8_4_ = fVar94 * fVar99;
    auVar170._12_4_ = fVar95 * fVar100;
    auVar170._16_4_ = fVar94 * fVar183;
    auVar170._20_4_ = fVar95 * fVar184;
    auVar170._24_4_ = fVar94 * fVar185;
    auVar170._28_4_ = uVar200;
    auVar9 = vfmadd231ps_fma(auVar170,auVar164,local_540);
    auVar132 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x484);
    auVar204 = ZEXT3264(auVar132);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar132,local_6a0);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar132,local_460);
    auVar170 = *(undefined1 (*) [32])(bezier_basis1 + lVar73);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar170,local_780);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar170,local_480);
    auVar82 = ZEXT1632(auVar8);
    auVar107 = ZEXT1632(auVar139);
    local_2c0 = vsubps_avx(auVar82,auVar107);
    local_280 = ZEXT1632(auVar9);
    local_2a0 = ZEXT1632(auVar138);
    local_2e0 = vsubps_avx(local_280,local_2a0);
    auVar83._0_4_ = local_2c0._0_4_ * auVar138._0_4_;
    auVar83._4_4_ = local_2c0._4_4_ * auVar138._4_4_;
    auVar83._8_4_ = local_2c0._8_4_ * auVar138._8_4_;
    auVar83._12_4_ = local_2c0._12_4_ * auVar138._12_4_;
    auVar83._16_4_ = local_2c0._16_4_ * 0.0;
    auVar83._20_4_ = local_2c0._20_4_ * 0.0;
    auVar83._24_4_ = local_2c0._24_4_ * 0.0;
    auVar83._28_4_ = 0;
    fVar96 = local_2e0._0_4_;
    auVar108._0_4_ = fVar96 * auVar139._0_4_;
    fVar193 = local_2e0._4_4_;
    auVar108._4_4_ = fVar193 * auVar139._4_4_;
    fVar194 = local_2e0._8_4_;
    auVar108._8_4_ = fVar194 * auVar139._8_4_;
    fVar195 = local_2e0._12_4_;
    auVar108._12_4_ = fVar195 * auVar139._12_4_;
    fVar211 = local_2e0._16_4_;
    auVar108._16_4_ = fVar211 * 0.0;
    fVar212 = local_2e0._20_4_;
    auVar108._20_4_ = fVar212 * 0.0;
    fVar213 = local_2e0._24_4_;
    auVar108._24_4_ = fVar213 * 0.0;
    auVar108._28_4_ = 0;
    auVar83 = vsubps_avx(auVar83,auVar108);
    auVar138 = vpermilps_avx(auVar76,0xff);
    uVar74 = auVar138._0_8_;
    local_80._8_8_ = uVar74;
    local_80._0_8_ = uVar74;
    local_80._16_8_ = uVar74;
    local_80._24_8_ = uVar74;
    auVar139 = vpermilps_avx(auVar10,0xff);
    uVar74 = auVar139._0_8_;
    auVar197._8_8_ = uVar74;
    auVar197._0_8_ = uVar74;
    auVar197._16_8_ = uVar74;
    auVar197._24_8_ = uVar74;
    auVar165 = ZEXT3264(_local_c0);
    uStack_304 = *(undefined4 *)(bezier_basis0 + lVar73 + 0xda8);
    auVar89._4_4_ = fStack_31c * fVar120;
    auVar89._0_4_ = local_320 * fVar120;
    auVar89._8_4_ = fStack_318 * fVar120;
    auVar89._12_4_ = fStack_314 * fVar120;
    auVar89._16_4_ = fStack_310 * fVar120;
    auVar89._20_4_ = fStack_30c * fVar120;
    auVar89._24_4_ = fStack_308 * fVar120;
    auVar89._28_4_ = uVar72;
    auVar8 = vfmadd231ps_fma(auVar89,_local_300,auVar197);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar106,local_80);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar160,local_a0);
    auVar91._4_4_ = fVar120 * fVar98;
    auVar91._0_4_ = fVar120 * fVar97;
    auVar91._8_4_ = fVar120 * fVar99;
    auVar91._12_4_ = fVar120 * fVar100;
    auVar91._16_4_ = fVar120 * fVar183;
    auVar91._20_4_ = fVar120 * fVar184;
    auVar91._24_4_ = fVar120 * fVar185;
    auVar91._28_4_ = auVar160._28_4_;
    auVar9 = vfmadd231ps_fma(auVar91,auVar164,auVar197);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar132,local_80);
    auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar170,local_a0);
    auVar13._4_4_ = fVar193 * fVar193;
    auVar13._0_4_ = fVar96 * fVar96;
    auVar13._8_4_ = fVar194 * fVar194;
    auVar13._12_4_ = fVar195 * fVar195;
    auVar13._16_4_ = fVar211 * fVar211;
    auVar13._20_4_ = fVar212 * fVar212;
    auVar13._24_4_ = fVar213 * fVar213;
    auVar13._28_4_ = auVar138._4_4_;
    auVar138 = vfmadd231ps_fma(auVar13,local_2c0,local_2c0);
    auVar89 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
    auVar90._4_4_ = auVar89._4_4_ * auVar89._4_4_ * auVar138._4_4_;
    auVar90._0_4_ = auVar89._0_4_ * auVar89._0_4_ * auVar138._0_4_;
    auVar90._8_4_ = auVar89._8_4_ * auVar89._8_4_ * auVar138._8_4_;
    auVar90._12_4_ = auVar89._12_4_ * auVar89._12_4_ * auVar138._12_4_;
    auVar90._16_4_ = auVar89._16_4_ * auVar89._16_4_ * 0.0;
    auVar90._20_4_ = auVar89._20_4_ * auVar89._20_4_ * 0.0;
    auVar90._24_4_ = auVar89._24_4_ * auVar89._24_4_ * 0.0;
    auVar90._28_4_ = auVar89._28_4_;
    auVar12._4_4_ = auVar83._4_4_ * auVar83._4_4_;
    auVar12._0_4_ = auVar83._0_4_ * auVar83._0_4_;
    auVar12._8_4_ = auVar83._8_4_ * auVar83._8_4_;
    auVar12._12_4_ = auVar83._12_4_ * auVar83._12_4_;
    auVar12._16_4_ = auVar83._16_4_ * auVar83._16_4_;
    auVar12._20_4_ = auVar83._20_4_ * auVar83._20_4_;
    auVar12._24_4_ = auVar83._24_4_ * auVar83._24_4_;
    auVar12._28_4_ = auVar83._28_4_;
    local_610._0_4_ = (undefined4)iVar6;
    register0x000015c4 = local_300._4_12_;
    auVar89 = vcmpps_avx(auVar12,auVar90,2);
    fVar96 = auVar140._0_4_ * 4.7683716e-07;
    auVar84._4_4_ = local_610._0_4_;
    auVar84._0_4_ = local_610._0_4_;
    auVar84._8_4_ = local_610._0_4_;
    auVar84._12_4_ = local_610._0_4_;
    auVar84._16_4_ = local_610._0_4_;
    auVar84._20_4_ = local_610._0_4_;
    auVar84._24_4_ = local_610._0_4_;
    auVar84._28_4_ = local_610._0_4_;
    auVar83 = vcmpps_avx(_DAT_01f7b060,auVar84,1);
    auVar140 = vpermilps_avx(auVar78,0xaa);
    uVar74 = auVar140._0_8_;
    auVar205._8_8_ = uVar74;
    auVar205._0_8_ = uVar74;
    auVar205._16_8_ = uVar74;
    auVar205._24_8_ = uVar74;
    auVar138 = vpermilps_avx(auVar77,0xaa);
    uVar74 = auVar138._0_8_;
    local_4c0._8_8_ = uVar74;
    local_4c0._0_8_ = uVar74;
    local_4c0._16_8_ = uVar74;
    local_4c0._24_8_ = uVar74;
    auVar138 = vpermilps_avx(auVar121,0xaa);
    uVar74 = auVar138._0_8_;
    auVar208._8_8_ = uVar74;
    auVar208._0_8_ = uVar74;
    auVar208._16_8_ = uVar74;
    auVar208._24_8_ = uVar74;
    auVar138 = vpermilps_avx(auVar102,0xaa);
    uVar74 = auVar138._0_8_;
    auVar91 = auVar83 & auVar89;
    uVar68 = *(uint *)(ray + k * 4 + 0x30);
    local_760._0_16_ = ZEXT416(uVar68);
    local_620 = ZEXT416((uint)local_560._4_4_);
    local_440 = ZEXT416(uVar65);
    local_7b0 = auVar76._0_8_;
    uStack_7a8 = auVar76._8_8_;
    local_7c0 = auVar10._0_8_;
    uStack_7b8 = auVar10._8_8_;
    uVar214 = uVar74;
    uVar215 = uVar74;
    uVar216 = uVar74;
    fStack_5dc = local_5e0;
    fStack_5d8 = local_5e0;
    fStack_5d4 = local_5e0;
    fStack_5d0 = local_5e0;
    fStack_5cc = local_5e0;
    fStack_5c8 = local_5e0;
    fStack_5c4 = local_5e0;
    uStack_5b8 = local_5c0;
    uStack_5b0 = local_5c0;
    uStack_5a8 = local_5c0;
    local_620._0_4_ = local_560._4_4_;
    if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar91 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar91 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar91 >> 0x7f,0) == '\0') &&
          (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar91 >> 0xbf,0) == '\0') &&
        (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar91[0x1f]) {
      auVar119 = ZEXT3264(local_640);
      auVar143 = ZEXT3264(local_540);
      auVar192 = ZEXT3264(local_6a0);
      auVar202 = ZEXT3264(local_780);
    }
    else {
      _local_340 = vandps_avx(auVar89,auVar83);
      fVar193 = auVar138._0_4_;
      fVar194 = auVar138._4_4_;
      auVar11._4_4_ = fVar194 * fVar98;
      auVar11._0_4_ = fVar193 * fVar97;
      auVar11._8_4_ = fVar193 * fVar99;
      auVar11._12_4_ = fVar194 * fVar100;
      auVar11._16_4_ = fVar193 * fVar183;
      auVar11._20_4_ = fVar194 * fVar184;
      auVar11._24_4_ = fVar193 * fVar185;
      auVar11._28_4_ = local_340._28_4_;
      auVar138 = vfmadd213ps_fma(auVar164,auVar208,auVar11);
      auVar138 = vfmadd213ps_fma(auVar132,local_4c0,ZEXT1632(auVar138));
      auVar138 = vfmadd213ps_fma(auVar170,auVar205,ZEXT1632(auVar138));
      auVar85._0_4_ = fVar193 * local_320;
      auVar85._4_4_ = fVar194 * fStack_31c;
      auVar85._8_4_ = fVar193 * fStack_318;
      auVar85._12_4_ = fVar194 * fStack_314;
      auVar85._16_4_ = fVar193 * fStack_310;
      auVar85._20_4_ = fVar194 * fStack_30c;
      auVar85._24_4_ = fVar193 * fStack_308;
      auVar85._28_4_ = 0;
      auVar78 = vfmadd213ps_fma(_local_300,auVar208,auVar85);
      auVar78 = vfmadd213ps_fma(auVar106,local_4c0,ZEXT1632(auVar78));
      auVar106 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1210);
      auVar164 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1694);
      auVar132 = *(undefined1 (*) [32])(bezier_basis0 + lVar73 + 0x1b18);
      fVar97 = *(float *)(bezier_basis0 + lVar73 + 0x1f9c);
      fVar98 = *(float *)(bezier_basis0 + lVar73 + 0x1fa0);
      fVar99 = *(float *)(bezier_basis0 + lVar73 + 0x1fa4);
      fVar100 = *(float *)(bezier_basis0 + lVar73 + 0x1fa8);
      fVar183 = *(float *)(bezier_basis0 + lVar73 + 0x1fac);
      fVar184 = *(float *)(bezier_basis0 + lVar73 + 0x1fb0);
      fVar185 = *(float *)(bezier_basis0 + lVar73 + 0x1fb4);
      auVar168._4_4_ = local_5e0 * fVar98;
      auVar168._0_4_ = local_5e0 * fVar97;
      auVar168._8_4_ = local_5e0 * fVar99;
      auVar168._12_4_ = local_5e0 * fVar100;
      auVar168._16_4_ = local_5e0 * fVar183;
      auVar168._20_4_ = local_5e0 * fVar184;
      auVar168._24_4_ = local_5e0 * fVar185;
      auVar168._28_4_ = fVar120;
      auVar180._0_4_ = fVar94 * fVar97;
      auVar180._4_4_ = fVar95 * fVar98;
      auVar180._8_4_ = fVar94 * fVar99;
      auVar180._12_4_ = fVar95 * fVar100;
      auVar180._16_4_ = fVar94 * fVar183;
      auVar180._20_4_ = fVar95 * fVar184;
      auVar180._24_4_ = fVar94 * fVar185;
      auVar180._28_4_ = 0;
      auVar178._4_4_ = fVar98 * fVar194;
      auVar178._0_4_ = fVar97 * fVar193;
      auVar178._8_4_ = fVar99 * fVar193;
      auVar178._12_4_ = fVar100 * fVar194;
      auVar178._16_4_ = fVar183 * fVar193;
      auVar178._20_4_ = fVar184 * fVar194;
      auVar178._24_4_ = fVar185 * fVar193;
      auVar178._28_4_ = auVar139._4_4_;
      auVar139 = vfmadd231ps_fma(auVar168,auVar132,local_260);
      auVar77 = vfmadd231ps_fma(auVar180,auVar132,local_540);
      auVar121 = vfmadd231ps_fma(auVar178,auVar208,auVar132);
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar164,local_6a0);
      auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar164,local_460);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),local_4c0,auVar164);
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar106,local_780);
      auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar106,local_480);
      auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar205,auVar106);
      fVar120 = *(float *)(bezier_basis1 + lVar73 + 0x1f9c);
      fVar97 = *(float *)(bezier_basis1 + lVar73 + 0x1fa0);
      fVar98 = *(float *)(bezier_basis1 + lVar73 + 0x1fa4);
      fVar99 = *(float *)(bezier_basis1 + lVar73 + 0x1fa8);
      fVar100 = *(float *)(bezier_basis1 + lVar73 + 0x1fac);
      fVar183 = *(float *)(bezier_basis1 + lVar73 + 0x1fb0);
      fVar184 = *(float *)(bezier_basis1 + lVar73 + 0x1fb4);
      auVar164._4_4_ = local_5e0 * fVar97;
      auVar164._0_4_ = local_5e0 * fVar120;
      auVar164._8_4_ = local_5e0 * fVar98;
      auVar164._12_4_ = local_5e0 * fVar99;
      auVar164._16_4_ = local_5e0 * fVar100;
      auVar164._20_4_ = local_5e0 * fVar183;
      auVar164._24_4_ = local_5e0 * fVar184;
      auVar164._28_4_ = local_5e0;
      auVar14._4_4_ = fVar95 * fVar97;
      auVar14._0_4_ = fVar94 * fVar120;
      auVar14._8_4_ = fVar94 * fVar98;
      auVar14._12_4_ = fVar95 * fVar99;
      auVar14._16_4_ = fVar94 * fVar100;
      auVar14._20_4_ = fVar95 * fVar183;
      auVar14._24_4_ = fVar94 * fVar184;
      auVar14._28_4_ = fVar95;
      auVar15._4_4_ = fVar97 * fVar194;
      auVar15._0_4_ = fVar120 * fVar193;
      auVar15._8_4_ = fVar98 * fVar193;
      auVar15._12_4_ = fVar99 * fVar194;
      auVar15._16_4_ = fVar100 * fVar193;
      auVar15._20_4_ = fVar183 * fVar194;
      auVar15._24_4_ = fVar184 * fVar193;
      auVar15._28_4_ = auVar140._4_4_;
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1b18);
      auVar140 = vfmadd231ps_fma(auVar164,auVar106,local_260);
      auVar102 = vfmadd231ps_fma(auVar14,auVar106,local_540);
      auVar103 = vfmadd231ps_fma(auVar15,auVar208,auVar106);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1694);
      auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar106,local_6a0);
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar106,local_460);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar106,local_4c0);
      auVar106 = *(undefined1 (*) [32])(bezier_basis1 + lVar73 + 0x1210);
      auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar106,local_780);
      auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar106,local_480);
      auVar109._8_4_ = 0x7fffffff;
      auVar109._0_8_ = 0x7fffffff7fffffff;
      auVar109._12_4_ = 0x7fffffff;
      auVar109._16_4_ = 0x7fffffff;
      auVar109._20_4_ = 0x7fffffff;
      auVar109._24_4_ = 0x7fffffff;
      auVar109._28_4_ = 0x7fffffff;
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar205,auVar106);
      auVar106 = vandps_avx(ZEXT1632(auVar139),auVar109);
      auVar164 = vandps_avx(ZEXT1632(auVar77),auVar109);
      auVar164 = vmaxps_avx(auVar106,auVar164);
      auVar106 = vandps_avx(ZEXT1632(auVar121),auVar109);
      auVar106 = vmaxps_avx(auVar164,auVar106);
      auVar130._4_4_ = fVar96;
      auVar130._0_4_ = fVar96;
      auVar130._8_4_ = fVar96;
      auVar130._12_4_ = fVar96;
      auVar130._16_4_ = fVar96;
      auVar130._20_4_ = fVar96;
      auVar130._24_4_ = fVar96;
      auVar130._28_4_ = fVar96;
      auVar106 = vcmpps_avx(auVar106,auVar130,1);
      auVar132 = vblendvps_avx(ZEXT1632(auVar139),local_2c0,auVar106);
      auVar170 = vblendvps_avx(ZEXT1632(auVar77),local_2e0,auVar106);
      auVar106 = vandps_avx(ZEXT1632(auVar140),auVar109);
      auVar164 = vandps_avx(ZEXT1632(auVar102),auVar109);
      auVar89 = vmaxps_avx(auVar106,auVar164);
      auVar106 = vandps_avx(ZEXT1632(auVar103),auVar109);
      auVar106 = vmaxps_avx(auVar89,auVar106);
      auVar83 = vcmpps_avx(auVar106,auVar130,1);
      auVar106 = vblendvps_avx(ZEXT1632(auVar140),local_2c0,auVar83);
      auVar89 = vblendvps_avx(ZEXT1632(auVar102),local_2e0,auVar83);
      auVar140 = vfmadd213ps_fma(auVar160,auVar205,ZEXT1632(auVar78));
      auVar139 = vfmadd213ps_fma(auVar132,auVar132,ZEXT832(0) << 0x20);
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar170,auVar170);
      auVar160 = vrsqrtps_avx(ZEXT1632(auVar139));
      fVar120 = auVar160._0_4_;
      fVar94 = auVar160._4_4_;
      fVar95 = auVar160._8_4_;
      fVar97 = auVar160._12_4_;
      fVar98 = auVar160._16_4_;
      fVar99 = auVar160._20_4_;
      fVar100 = auVar160._24_4_;
      auVar16._4_4_ = fVar94 * fVar94 * fVar94 * auVar139._4_4_ * -0.5;
      auVar16._0_4_ = fVar120 * fVar120 * fVar120 * auVar139._0_4_ * -0.5;
      auVar16._8_4_ = fVar95 * fVar95 * fVar95 * auVar139._8_4_ * -0.5;
      auVar16._12_4_ = fVar97 * fVar97 * fVar97 * auVar139._12_4_ * -0.5;
      auVar16._16_4_ = fVar98 * fVar98 * fVar98 * -0.0;
      auVar16._20_4_ = fVar99 * fVar99 * fVar99 * -0.0;
      auVar16._24_4_ = fVar100 * fVar100 * fVar100 * -0.0;
      auVar16._28_4_ = auVar164._28_4_;
      auVar209._8_4_ = 0x3fc00000;
      auVar209._0_8_ = 0x3fc000003fc00000;
      auVar209._12_4_ = 0x3fc00000;
      auVar209._16_4_ = 0x3fc00000;
      auVar209._20_4_ = 0x3fc00000;
      auVar209._24_4_ = 0x3fc00000;
      auVar209._28_4_ = 0x3fc00000;
      auVar139 = vfmadd231ps_fma(auVar16,auVar209,auVar160);
      fVar120 = auVar139._0_4_;
      fVar94 = auVar139._4_4_;
      auVar17._4_4_ = fVar94 * auVar170._4_4_;
      auVar17._0_4_ = fVar120 * auVar170._0_4_;
      fVar95 = auVar139._8_4_;
      auVar17._8_4_ = fVar95 * auVar170._8_4_;
      fVar97 = auVar139._12_4_;
      auVar17._12_4_ = fVar97 * auVar170._12_4_;
      auVar17._16_4_ = auVar170._16_4_ * 0.0;
      auVar17._20_4_ = auVar170._20_4_ * 0.0;
      auVar17._24_4_ = auVar170._24_4_ * 0.0;
      auVar17._28_4_ = 0;
      auVar18._4_4_ = fVar94 * -auVar132._4_4_;
      auVar18._0_4_ = fVar120 * -auVar132._0_4_;
      auVar18._8_4_ = fVar95 * -auVar132._8_4_;
      auVar18._12_4_ = fVar97 * -auVar132._12_4_;
      auVar18._16_4_ = -auVar132._16_4_ * 0.0;
      auVar18._20_4_ = -auVar132._20_4_ * 0.0;
      auVar18._24_4_ = -auVar132._24_4_ * 0.0;
      auVar18._28_4_ = auVar160._28_4_;
      auVar139 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar89,auVar89);
      auVar160 = vrsqrtps_avx(ZEXT1632(auVar139));
      auVar19._28_4_ = auVar83._28_4_;
      auVar19._0_28_ =
           ZEXT1628(CONCAT412(fVar97 * 0.0,
                              CONCAT48(fVar95 * 0.0,CONCAT44(fVar94 * 0.0,fVar120 * 0.0))));
      fVar120 = auVar160._0_4_;
      fVar94 = auVar160._4_4_;
      fVar95 = auVar160._8_4_;
      fVar97 = auVar160._12_4_;
      fVar98 = auVar160._16_4_;
      fVar99 = auVar160._20_4_;
      fVar100 = auVar160._24_4_;
      auVar20._4_4_ = fVar94 * fVar94 * fVar94 * auVar139._4_4_ * -0.5;
      auVar20._0_4_ = fVar120 * fVar120 * fVar120 * auVar139._0_4_ * -0.5;
      auVar20._8_4_ = fVar95 * fVar95 * fVar95 * auVar139._8_4_ * -0.5;
      auVar20._12_4_ = fVar97 * fVar97 * fVar97 * auVar139._12_4_ * -0.5;
      auVar20._16_4_ = fVar98 * fVar98 * fVar98 * -0.0;
      auVar20._20_4_ = fVar99 * fVar99 * fVar99 * -0.0;
      auVar20._24_4_ = fVar100 * fVar100 * fVar100 * -0.0;
      auVar20._28_4_ = 0;
      auVar139 = vfmadd231ps_fma(auVar20,auVar209,auVar160);
      fVar120 = auVar139._0_4_;
      auVar198._0_4_ = auVar89._0_4_ * fVar120;
      fVar94 = auVar139._4_4_;
      auVar198._4_4_ = auVar89._4_4_ * fVar94;
      fVar95 = auVar139._8_4_;
      auVar198._8_4_ = auVar89._8_4_ * fVar95;
      fVar97 = auVar139._12_4_;
      auVar198._12_4_ = auVar89._12_4_ * fVar97;
      auVar198._16_4_ = auVar89._16_4_ * 0.0;
      auVar198._20_4_ = auVar89._20_4_ * 0.0;
      auVar198._24_4_ = auVar89._24_4_ * 0.0;
      auVar198._28_4_ = 0;
      auVar21._4_4_ = -auVar106._4_4_ * fVar94;
      auVar21._0_4_ = -auVar106._0_4_ * fVar120;
      auVar21._8_4_ = -auVar106._8_4_ * fVar95;
      auVar21._12_4_ = -auVar106._12_4_ * fVar97;
      auVar21._16_4_ = -auVar106._16_4_ * 0.0;
      auVar21._20_4_ = -auVar106._20_4_ * 0.0;
      auVar21._24_4_ = -auVar106._24_4_ * 0.0;
      auVar21._28_4_ = auVar89._28_4_;
      auVar22._28_4_ = auVar160._28_4_;
      auVar22._0_28_ =
           ZEXT1628(CONCAT412(fVar97 * 0.0,
                              CONCAT48(fVar95 * 0.0,CONCAT44(fVar94 * 0.0,fVar120 * 0.0))));
      auVar139 = vfmadd213ps_fma(auVar17,ZEXT1632(auVar8),auVar107);
      auVar106 = ZEXT1632(auVar8);
      auVar78 = vfmadd213ps_fma(auVar18,auVar106,local_2a0);
      auVar77 = vfmadd213ps_fma(auVar19,auVar106,ZEXT1632(auVar140));
      auVar102 = vfnmadd213ps_fma(auVar17,auVar106,auVar107);
      auVar121 = vfmadd213ps_fma(auVar198,ZEXT1632(auVar9),auVar82);
      auVar103 = vfnmadd213ps_fma(auVar18,auVar106,local_2a0);
      auVar178 = ZEXT1632(auVar9);
      auVar9 = vfmadd213ps_fma(auVar21,auVar178,local_280);
      auVar168 = ZEXT1632(auVar8);
      auVar75 = vfnmadd231ps_fma(ZEXT1632(auVar140),auVar168,auVar19);
      auVar8 = vfmadd213ps_fma(auVar22,auVar178,ZEXT1632(auVar138));
      auVar134 = vfnmadd213ps_fma(auVar198,auVar178,auVar82);
      auVar145 = vfnmadd213ps_fma(auVar21,auVar178,local_280);
      auVar101 = vfnmadd231ps_fma(ZEXT1632(auVar138),auVar178,auVar22);
      auVar106 = vsubps_avx(ZEXT1632(auVar9),ZEXT1632(auVar103));
      auVar160 = vsubps_avx(ZEXT1632(auVar8),ZEXT1632(auVar75));
      auVar82._4_4_ = auVar75._4_4_ * auVar106._4_4_;
      auVar82._0_4_ = auVar75._0_4_ * auVar106._0_4_;
      auVar82._8_4_ = auVar75._8_4_ * auVar106._8_4_;
      auVar82._12_4_ = auVar75._12_4_ * auVar106._12_4_;
      auVar82._16_4_ = auVar106._16_4_ * 0.0;
      auVar82._20_4_ = auVar106._20_4_ * 0.0;
      auVar82._24_4_ = auVar106._24_4_ * 0.0;
      auVar82._28_4_ = 0;
      auVar138 = vfmsub231ps_fma(auVar82,ZEXT1632(auVar103),auVar160);
      auVar107._4_4_ = auVar160._4_4_ * auVar102._4_4_;
      auVar107._0_4_ = auVar160._0_4_ * auVar102._0_4_;
      auVar107._8_4_ = auVar160._8_4_ * auVar102._8_4_;
      auVar107._12_4_ = auVar160._12_4_ * auVar102._12_4_;
      auVar107._16_4_ = auVar160._16_4_ * 0.0;
      auVar107._20_4_ = auVar160._20_4_ * 0.0;
      auVar107._24_4_ = auVar160._24_4_ * 0.0;
      auVar107._28_4_ = auVar160._28_4_;
      auVar160 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar102));
      auVar140 = vfmsub231ps_fma(auVar107,ZEXT1632(auVar75),auVar160);
      auVar23._4_4_ = auVar103._4_4_ * auVar160._4_4_;
      auVar23._0_4_ = auVar103._0_4_ * auVar160._0_4_;
      auVar23._8_4_ = auVar103._8_4_ * auVar160._8_4_;
      auVar23._12_4_ = auVar103._12_4_ * auVar160._12_4_;
      auVar23._16_4_ = auVar160._16_4_ * 0.0;
      auVar23._20_4_ = auVar160._20_4_ * 0.0;
      auVar23._24_4_ = auVar160._24_4_ * 0.0;
      auVar23._28_4_ = auVar160._28_4_;
      auVar83 = ZEXT1632(auVar102);
      auVar102 = vfmsub231ps_fma(auVar23,auVar83,auVar106);
      auVar140 = vfmadd231ps_fma(ZEXT1632(auVar102),ZEXT832(0) << 0x20,ZEXT1632(auVar140));
      auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),ZEXT832(0) << 0x20,ZEXT1632(auVar138));
      auVar90 = vcmpps_avx(ZEXT1632(auVar140),ZEXT832(0) << 0x20,2);
      auVar106 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar139),auVar90);
      auVar160 = vblendvps_avx(ZEXT1632(auVar145),ZEXT1632(auVar78),auVar90);
      auVar164 = vblendvps_avx(ZEXT1632(auVar101),ZEXT1632(auVar77),auVar90);
      auVar204 = ZEXT3264(auVar164);
      auVar132 = vblendvps_avx(auVar83,ZEXT1632(auVar121),auVar90);
      auVar170 = vblendvps_avx(ZEXT1632(auVar103),ZEXT1632(auVar9),auVar90);
      auVar89 = vblendvps_avx(ZEXT1632(auVar75),ZEXT1632(auVar8),auVar90);
      auVar83 = vblendvps_avx(ZEXT1632(auVar121),auVar83,auVar90);
      auVar91 = vblendvps_avx(ZEXT1632(auVar9),ZEXT1632(auVar103),auVar90);
      auVar140 = vpackssdw_avx(local_340._0_16_,local_340._16_16_);
      auVar13 = vblendvps_avx(ZEXT1632(auVar8),ZEXT1632(auVar75),auVar90);
      auVar12 = vsubps_avx(auVar83,auVar106);
      auVar82 = vsubps_avx(auVar91,auVar160);
      auVar84 = vsubps_avx(auVar13,auVar164);
      auVar107 = vsubps_avx(auVar106,auVar132);
      auVar108 = vsubps_avx(auVar160,auVar170);
      auVar11 = vsubps_avx(auVar164,auVar89);
      auVar24._4_4_ = auVar84._4_4_ * auVar106._4_4_;
      auVar24._0_4_ = auVar84._0_4_ * auVar106._0_4_;
      auVar24._8_4_ = auVar84._8_4_ * auVar106._8_4_;
      auVar24._12_4_ = auVar84._12_4_ * auVar106._12_4_;
      auVar24._16_4_ = auVar84._16_4_ * auVar106._16_4_;
      auVar24._20_4_ = auVar84._20_4_ * auVar106._20_4_;
      auVar24._24_4_ = auVar84._24_4_ * auVar106._24_4_;
      auVar24._28_4_ = auVar13._28_4_;
      auVar138 = vfmsub231ps_fma(auVar24,auVar164,auVar12);
      auVar25._4_4_ = auVar12._4_4_ * auVar160._4_4_;
      auVar25._0_4_ = auVar12._0_4_ * auVar160._0_4_;
      auVar25._8_4_ = auVar12._8_4_ * auVar160._8_4_;
      auVar25._12_4_ = auVar12._12_4_ * auVar160._12_4_;
      auVar25._16_4_ = auVar12._16_4_ * auVar160._16_4_;
      auVar25._20_4_ = auVar12._20_4_ * auVar160._20_4_;
      auVar25._24_4_ = auVar12._24_4_ * auVar160._24_4_;
      auVar25._28_4_ = auVar83._28_4_;
      auVar139 = vfmsub231ps_fma(auVar25,auVar106,auVar82);
      auVar138 = vfmadd231ps_fma(ZEXT1632(auVar139),ZEXT832(0) << 0x20,ZEXT1632(auVar138));
      auVar86._0_4_ = auVar82._0_4_ * auVar164._0_4_;
      auVar86._4_4_ = auVar82._4_4_ * auVar164._4_4_;
      auVar86._8_4_ = auVar82._8_4_ * auVar164._8_4_;
      auVar86._12_4_ = auVar82._12_4_ * auVar164._12_4_;
      auVar86._16_4_ = auVar82._16_4_ * auVar164._16_4_;
      auVar86._20_4_ = auVar82._20_4_ * auVar164._20_4_;
      auVar86._24_4_ = auVar82._24_4_ * auVar164._24_4_;
      auVar86._28_4_ = 0;
      auVar139 = vfmsub231ps_fma(auVar86,auVar160,auVar84);
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar138),ZEXT832(0) << 0x20,ZEXT1632(auVar139));
      auVar87._0_4_ = auVar11._0_4_ * auVar132._0_4_;
      auVar87._4_4_ = auVar11._4_4_ * auVar132._4_4_;
      auVar87._8_4_ = auVar11._8_4_ * auVar132._8_4_;
      auVar87._12_4_ = auVar11._12_4_ * auVar132._12_4_;
      auVar87._16_4_ = auVar11._16_4_ * auVar132._16_4_;
      auVar87._20_4_ = auVar11._20_4_ * auVar132._20_4_;
      auVar87._24_4_ = auVar11._24_4_ * auVar132._24_4_;
      auVar87._28_4_ = 0;
      auVar138 = vfmsub231ps_fma(auVar87,auVar107,auVar89);
      auVar26._4_4_ = auVar108._4_4_ * auVar89._4_4_;
      auVar26._0_4_ = auVar108._0_4_ * auVar89._0_4_;
      auVar26._8_4_ = auVar108._8_4_ * auVar89._8_4_;
      auVar26._12_4_ = auVar108._12_4_ * auVar89._12_4_;
      auVar26._16_4_ = auVar108._16_4_ * auVar89._16_4_;
      auVar26._20_4_ = auVar108._20_4_ * auVar89._20_4_;
      auVar26._24_4_ = auVar108._24_4_ * auVar89._24_4_;
      auVar26._28_4_ = auVar89._28_4_;
      auVar8 = vfmsub231ps_fma(auVar26,auVar170,auVar11);
      auVar27._4_4_ = auVar107._4_4_ * auVar170._4_4_;
      auVar27._0_4_ = auVar107._0_4_ * auVar170._0_4_;
      auVar27._8_4_ = auVar107._8_4_ * auVar170._8_4_;
      auVar27._12_4_ = auVar107._12_4_ * auVar170._12_4_;
      auVar27._16_4_ = auVar107._16_4_ * auVar170._16_4_;
      auVar27._20_4_ = auVar107._20_4_ * auVar170._20_4_;
      auVar27._24_4_ = auVar107._24_4_ * auVar170._24_4_;
      auVar27._28_4_ = auVar91._28_4_;
      auVar9 = vfmsub231ps_fma(auVar27,auVar108,auVar132);
      auVar138 = vfmadd231ps_fma(ZEXT1632(auVar9),ZEXT832(0) << 0x20,ZEXT1632(auVar138));
      auVar8 = vfmadd231ps_fma(ZEXT1632(auVar138),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
      auVar165 = ZEXT1664(auVar8);
      auVar132 = vmaxps_avx(ZEXT1632(auVar139),ZEXT1632(auVar8));
      auVar132 = vcmpps_avx(auVar132,ZEXT832(0) << 0x20,2);
      auVar138 = vpackssdw_avx(auVar132._0_16_,auVar132._16_16_);
      auVar140 = vpand_avx(auVar138,auVar140);
      auVar132 = vpmovsxwd_avx2(auVar140);
      if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar132 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar132 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar132 >> 0x7f,0) == '\0') &&
            (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar132 >> 0xbf,0) == '\0') &&
          (auVar132 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar132[0x1f]) {
LAB_0114f7d2:
        auVar149._8_8_ = uStack_4d8;
        auVar149._0_8_ = local_4e0;
        auVar149._16_8_ = uStack_4d0;
        auVar149._24_8_ = uStack_4c8;
      }
      else {
        auVar28._4_4_ = auVar82._4_4_ * auVar11._4_4_;
        auVar28._0_4_ = auVar82._0_4_ * auVar11._0_4_;
        auVar28._8_4_ = auVar82._8_4_ * auVar11._8_4_;
        auVar28._12_4_ = auVar82._12_4_ * auVar11._12_4_;
        auVar28._16_4_ = auVar82._16_4_ * auVar11._16_4_;
        auVar28._20_4_ = auVar82._20_4_ * auVar11._20_4_;
        auVar28._24_4_ = auVar82._24_4_ * auVar11._24_4_;
        auVar28._28_4_ = auVar132._28_4_;
        auVar77 = vfmsub231ps_fma(auVar28,auVar108,auVar84);
        auVar110._0_4_ = auVar84._0_4_ * auVar107._0_4_;
        auVar110._4_4_ = auVar84._4_4_ * auVar107._4_4_;
        auVar110._8_4_ = auVar84._8_4_ * auVar107._8_4_;
        auVar110._12_4_ = auVar84._12_4_ * auVar107._12_4_;
        auVar110._16_4_ = auVar84._16_4_ * auVar107._16_4_;
        auVar110._20_4_ = auVar84._20_4_ * auVar107._20_4_;
        auVar110._24_4_ = auVar84._24_4_ * auVar107._24_4_;
        auVar110._28_4_ = 0;
        auVar78 = vfmsub231ps_fma(auVar110,auVar12,auVar11);
        auVar29._4_4_ = auVar12._4_4_ * auVar108._4_4_;
        auVar29._0_4_ = auVar12._0_4_ * auVar108._0_4_;
        auVar29._8_4_ = auVar12._8_4_ * auVar108._8_4_;
        auVar29._12_4_ = auVar12._12_4_ * auVar108._12_4_;
        auVar29._16_4_ = auVar12._16_4_ * auVar108._16_4_;
        auVar29._20_4_ = auVar12._20_4_ * auVar108._20_4_;
        auVar29._24_4_ = auVar12._24_4_ * auVar108._24_4_;
        auVar29._28_4_ = auVar170._28_4_;
        auVar121 = vfmsub231ps_fma(auVar29,auVar107,auVar82);
        auVar138 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar78),ZEXT1632(auVar121));
        auVar9 = vfmadd231ps_fma(ZEXT1632(auVar138),ZEXT1632(auVar77),_DAT_01f7b000);
        auVar132 = vrcpps_avx(ZEXT1632(auVar9));
        auVar199._8_4_ = 0x3f800000;
        auVar199._0_8_ = 0x3f8000003f800000;
        auVar199._12_4_ = 0x3f800000;
        auVar199._16_4_ = 0x3f800000;
        auVar199._20_4_ = 0x3f800000;
        auVar199._24_4_ = 0x3f800000;
        auVar199._28_4_ = 0x3f800000;
        auVar138 = vfnmadd213ps_fma(auVar132,ZEXT1632(auVar9),auVar199);
        auVar138 = vfmadd132ps_fma(ZEXT1632(auVar138),auVar132,auVar132);
        auVar169._0_4_ = auVar121._0_4_ * auVar164._0_4_;
        auVar169._4_4_ = auVar121._4_4_ * auVar164._4_4_;
        auVar169._8_4_ = auVar121._8_4_ * auVar164._8_4_;
        auVar169._12_4_ = auVar121._12_4_ * auVar164._12_4_;
        auVar169._16_4_ = auVar164._16_4_ * 0.0;
        auVar169._20_4_ = auVar164._20_4_ * 0.0;
        auVar169._24_4_ = auVar164._24_4_ * 0.0;
        auVar169._28_4_ = 0;
        auVar78 = vfmadd231ps_fma(auVar169,auVar160,ZEXT1632(auVar78));
        auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),ZEXT1632(auVar77),auVar106);
        fVar120 = auVar138._0_4_;
        fVar94 = auVar138._4_4_;
        fVar95 = auVar138._8_4_;
        fVar97 = auVar138._12_4_;
        auVar170 = ZEXT1632(CONCAT412(fVar97 * auVar78._12_4_,
                                      CONCAT48(fVar95 * auVar78._8_4_,
                                               CONCAT44(fVar94 * auVar78._4_4_,
                                                        fVar120 * auVar78._0_4_))));
        auVar88._4_4_ = uVar68;
        auVar88._0_4_ = uVar68;
        auVar88._8_4_ = uVar68;
        auVar88._12_4_ = uVar68;
        auVar88._16_4_ = uVar68;
        auVar88._20_4_ = uVar68;
        auVar88._24_4_ = uVar68;
        auVar88._28_4_ = uVar68;
        uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar111._4_4_ = uVar72;
        auVar111._0_4_ = uVar72;
        auVar111._8_4_ = uVar72;
        auVar111._12_4_ = uVar72;
        auVar111._16_4_ = uVar72;
        auVar111._20_4_ = uVar72;
        auVar111._24_4_ = uVar72;
        auVar111._28_4_ = uVar72;
        auVar160 = vcmpps_avx(auVar88,auVar170,2);
        auVar132 = vcmpps_avx(auVar170,auVar111,2);
        auVar160 = vandps_avx(auVar132,auVar160);
        auVar138 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
        auVar140 = vpand_avx(auVar140,auVar138);
        auVar160 = vpmovsxwd_avx2(auVar140);
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar160 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar160 >> 0x7f,0) == '\0') &&
              (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar160 >> 0xbf,0) == '\0') &&
            (auVar160 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar160[0x1f]) goto LAB_0114f7d2;
        auVar160 = vcmpps_avx(ZEXT1632(auVar9),ZEXT832(0) << 0x20,4);
        auVar138 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
        auVar140 = vpand_avx(auVar140,auVar138);
        auVar160 = vpmovsxwd_avx2(auVar140);
        auVar149._8_8_ = uStack_4d8;
        auVar149._0_8_ = local_4e0;
        auVar149._16_8_ = uStack_4d0;
        auVar149._24_8_ = uStack_4c8;
        if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar160 >> 0x7f,0) != '\0') ||
              (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar160 >> 0xbf,0) != '\0') ||
            (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar160[0x1f] < '\0') {
          auVar89 = ZEXT1632(CONCAT412(fVar97 * auVar139._12_4_,
                                       CONCAT48(fVar95 * auVar139._8_4_,
                                                CONCAT44(fVar94 * auVar139._4_4_,
                                                         fVar120 * auVar139._0_4_))));
          auVar83 = ZEXT1632(CONCAT412(fVar97 * auVar8._12_4_,
                                       CONCAT48(fVar95 * auVar8._8_4_,
                                                CONCAT44(fVar94 * auVar8._4_4_,
                                                         fVar120 * auVar8._0_4_))));
          auVar148._8_4_ = 0x3f800000;
          auVar148._0_8_ = 0x3f8000003f800000;
          auVar148._12_4_ = 0x3f800000;
          auVar148._16_4_ = 0x3f800000;
          auVar148._20_4_ = 0x3f800000;
          auVar148._24_4_ = 0x3f800000;
          auVar148._28_4_ = 0x3f800000;
          auVar132 = vsubps_avx(auVar148,auVar89);
          _local_e0 = vblendvps_avx(auVar132,auVar89,auVar90);
          auVar132 = vsubps_avx(auVar148,auVar83);
          local_360 = vblendvps_avx(auVar132,auVar83,auVar90);
          auVar149 = auVar160;
          local_4a0 = auVar170;
        }
      }
      auVar150 = ZEXT3264(auVar208);
      auVar143 = ZEXT3264(auVar205);
      auVar202 = ZEXT3264(local_780);
      auVar119 = ZEXT3264(auVar197);
      auVar192 = ZEXT3264(local_6a0);
      if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar149 >> 0x7f,0) == '\0') &&
            (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar149 >> 0xbf,0) == '\0') &&
          (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar149[0x1f]) {
        auVar119 = ZEXT3264(local_640);
        auVar143 = ZEXT3264(local_540);
      }
      else {
        auVar160 = vsubps_avx(auVar178,auVar168);
        auVar140 = vfmadd213ps_fma(auVar160,_local_e0,auVar168);
        fVar120 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
        auVar30._4_4_ = (auVar140._4_4_ + auVar140._4_4_) * fVar120;
        auVar30._0_4_ = (auVar140._0_4_ + auVar140._0_4_) * fVar120;
        auVar30._8_4_ = (auVar140._8_4_ + auVar140._8_4_) * fVar120;
        auVar30._12_4_ = (auVar140._12_4_ + auVar140._12_4_) * fVar120;
        auVar30._16_4_ = fVar120 * 0.0;
        auVar30._20_4_ = fVar120 * 0.0;
        auVar30._24_4_ = fVar120 * 0.0;
        auVar30._28_4_ = 0;
        auVar160 = vcmpps_avx(local_4a0,auVar30,6);
        auVar132 = auVar149 & auVar160;
        if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar132 >> 0x7f,0) != '\0') ||
              (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar132 >> 0xbf,0) != '\0') ||
            (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar132[0x1f] < '\0') {
          auVar112._8_4_ = 0xbf800000;
          auVar112._0_8_ = 0xbf800000bf800000;
          auVar112._12_4_ = 0xbf800000;
          auVar112._16_4_ = 0xbf800000;
          auVar112._20_4_ = 0xbf800000;
          auVar112._24_4_ = 0xbf800000;
          auVar112._28_4_ = 0xbf800000;
          auVar131._8_4_ = 0x40000000;
          auVar131._0_8_ = 0x4000000040000000;
          auVar131._12_4_ = 0x40000000;
          auVar131._16_4_ = 0x40000000;
          auVar131._20_4_ = 0x40000000;
          auVar131._24_4_ = 0x40000000;
          auVar131._28_4_ = 0x40000000;
          auVar140 = vfmadd213ps_fma(local_360,auVar131,auVar112);
          auVar165 = ZEXT1664(auVar140);
          local_220 = _local_e0;
          local_360 = ZEXT1632(auVar140);
          auVar132 = local_360;
          local_200 = ZEXT1632(auVar140);
          local_1e0 = local_4a0;
          local_1c0 = 0;
          local_1bc = iVar6;
          local_1b0 = local_720._0_8_;
          uStack_1a8 = local_720._8_8_;
          local_1a0 = local_7b0;
          uStack_198 = uStack_7a8;
          local_190 = local_7c0;
          uStack_188 = uStack_7b8;
          local_180 = local_730;
          uStack_178 = uStack_728;
          local_360 = auVar132;
          if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
            local_520 = vandps_avx(auVar160,auVar149);
            fVar120 = 1.0 / (float)local_610._0_4_;
            local_140[0] = fVar120 * ((float)local_e0._0_4_ + 0.0);
            local_140[1] = fVar120 * ((float)local_e0._4_4_ + 1.0);
            local_140[2] = fVar120 * (fStack_d8 + 2.0);
            local_140[3] = fVar120 * (fStack_d4 + 3.0);
            fStack_130 = fVar120 * (fStack_d0 + 4.0);
            fStack_12c = fVar120 * (fStack_cc + 5.0);
            fStack_128 = fVar120 * (fStack_c8 + 6.0);
            fStack_124 = fStack_c4 + 7.0;
            local_360._0_8_ = auVar140._0_8_;
            local_360._8_8_ = auVar140._8_8_;
            local_120 = local_360._0_8_;
            uStack_118 = local_360._8_8_;
            uStack_110 = 0;
            uStack_108 = 0;
            local_100 = local_4a0;
            auVar113._8_4_ = 0x7f800000;
            auVar113._0_8_ = 0x7f8000007f800000;
            auVar113._12_4_ = 0x7f800000;
            auVar113._16_4_ = 0x7f800000;
            auVar113._20_4_ = 0x7f800000;
            auVar113._24_4_ = 0x7f800000;
            auVar113._28_4_ = 0x7f800000;
            auVar160 = vblendvps_avx(auVar113,local_4a0,local_520);
            auVar132 = vshufps_avx(auVar160,auVar160,0xb1);
            auVar132 = vminps_avx(auVar160,auVar132);
            auVar170 = vshufpd_avx(auVar132,auVar132,5);
            auVar132 = vminps_avx(auVar132,auVar170);
            auVar170 = vpermpd_avx2(auVar132,0x4e);
            auVar132 = vminps_avx(auVar132,auVar170);
            auVar132 = vcmpps_avx(auVar160,auVar132,0);
            auVar170 = local_520 & auVar132;
            auVar160 = local_520;
            if ((((((((auVar170 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar170 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar170 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar170 >> 0x7f,0) != '\0') ||
                  (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar170 >> 0xbf,0) != '\0') ||
                (auVar170 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar170[0x1f] < '\0') {
              auVar160 = vandps_avx(auVar132,local_520);
            }
            uVar64 = vmovmskps_avx(auVar160);
            uVar68 = 0;
            for (; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x80000000) {
              uVar68 = uVar68 + 1;
            }
            uVar69 = (ulong)uVar68;
            if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
               (pGVar71->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
              fVar120 = local_140[uVar69];
              uVar72 = *(undefined4 *)((long)&local_120 + uVar69 * 4);
              fVar95 = 1.0 - fVar120;
              fVar94 = fVar95 * fVar95 * -3.0;
              auVar140 = vfmadd231ss_fma(ZEXT416((uint)(fVar95 * fVar95)),
                                         ZEXT416((uint)(fVar120 * fVar95)),ZEXT416(0xc0000000));
              auVar138 = vfmsub132ss_fma(ZEXT416((uint)(fVar120 * fVar95)),
                                         ZEXT416((uint)(fVar120 * fVar120)),ZEXT416(0x40000000));
              fVar95 = auVar140._0_4_ * 3.0;
              fVar97 = auVar138._0_4_ * 3.0;
              fVar98 = fVar120 * fVar120 * 3.0;
              auVar156._0_4_ = fVar98 * (float)local_730._0_4_;
              auVar156._4_4_ = fVar98 * (float)local_730._4_4_;
              auVar156._8_4_ = fVar98 * (float)uStack_728;
              auVar156._12_4_ = fVar98 * uStack_728._4_4_;
              auVar165 = ZEXT1664(auVar156);
              auVar122._4_4_ = fVar97;
              auVar122._0_4_ = fVar97;
              auVar122._8_4_ = fVar97;
              auVar122._12_4_ = fVar97;
              auVar140 = vfmadd132ps_fma(auVar122,auVar156,auVar10);
              auVar136._4_4_ = fVar95;
              auVar136._0_4_ = fVar95;
              auVar136._8_4_ = fVar95;
              auVar136._12_4_ = fVar95;
              auVar140 = vfmadd132ps_fma(auVar136,auVar140,auVar76);
              auVar123._4_4_ = fVar94;
              auVar123._0_4_ = fVar94;
              auVar123._8_4_ = fVar94;
              auVar123._12_4_ = fVar94;
              auVar140 = vfmadd132ps_fma(auVar123,auVar140,local_720);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + uVar69 * 4);
              *(int *)(ray + k * 4 + 0xc0) = auVar140._0_4_;
              uVar200 = vextractps_avx(auVar140,1);
              *(undefined4 *)(ray + k * 4 + 0xd0) = uVar200;
              uVar200 = vextractps_avx(auVar140,2);
              *(undefined4 *)(ray + k * 4 + 0xe0) = uVar200;
              *(float *)(ray + k * 4 + 0xf0) = fVar120;
              *(undefined4 *)(ray + k * 4 + 0x100) = uVar72;
              *(uint *)(ray + k * 4 + 0x110) = uVar65;
              *(undefined4 *)(ray + k * 4 + 0x120) = local_560._4_4_;
              *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
              *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
            }
            else {
              local_560._0_4_ = local_560._4_4_;
              local_560._8_4_ = local_560._4_4_;
              local_560._16_16_ = auVar164._16_16_;
              local_560._12_4_ = local_560._4_4_;
              local_580._0_8_ = CONCAT44(uVar65,uVar65);
              local_580 = ZEXT1632(CONCAT412(uVar65,CONCAT48(uVar65,local_580._0_8_)));
              local_5a0 = ZEXT1632(*local_670);
              auStack_810 = auVar106._16_16_;
              local_820 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
              local_6e0 = auVar205;
              uStack_6b0 = uVar74;
              uStack_6a8 = uVar74;
              local_660 = auVar197;
              local_600 = auVar208;
              local_6c0 = uVar74;
              uStack_6b8 = uVar74;
              while( true ) {
                auVar106 = _local_820;
                local_400 = local_140[uVar69];
                local_3f0 = *(undefined4 *)((long)&local_120 + uVar69 * 4);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + uVar69 * 4);
                fVar95 = 1.0 - local_400;
                auVar138 = vfmadd231ss_fma(ZEXT416((uint)(fVar95 * fVar95)),
                                           ZEXT416((uint)(local_400 * fVar95)),ZEXT416(0xc0000000));
                auVar140 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar95)),
                                           ZEXT416((uint)(local_400 * local_400)),
                                           ZEXT416(0x40000000));
                fVar120 = auVar140._0_4_ * 3.0;
                fVar94 = local_400 * local_400 * 3.0;
                auVar159._0_4_ = fVar94 * (float)local_730._0_4_;
                auVar159._4_4_ = fVar94 * (float)local_730._4_4_;
                auVar159._8_4_ = fVar94 * (float)uStack_728;
                auVar159._12_4_ = fVar94 * uStack_728._4_4_;
                auVar165 = ZEXT1664(auVar159);
                auVar128._4_4_ = fVar120;
                auVar128._0_4_ = fVar120;
                auVar128._8_4_ = fVar120;
                auVar128._12_4_ = fVar120;
                auVar140 = vfmadd132ps_fma(auVar128,auVar159,auVar10);
                fVar120 = auVar138._0_4_ * 3.0;
                auVar147._4_4_ = fVar120;
                auVar147._0_4_ = fVar120;
                auVar147._8_4_ = fVar120;
                auVar147._12_4_ = fVar120;
                auVar140 = vfmadd132ps_fma(auVar147,auVar140,auVar76);
                fVar120 = fVar95 * fVar95 * -3.0;
                local_710.context = context->user;
                auVar129._4_4_ = fVar120;
                auVar129._0_4_ = fVar120;
                auVar129._8_4_ = fVar120;
                auVar129._12_4_ = fVar120;
                auVar138 = vfmadd132ps_fma(auVar129,auVar140,local_720);
                local_430 = auVar138._0_4_;
                uStack_42c = local_430;
                uStack_428 = local_430;
                uStack_424 = local_430;
                auVar140 = vshufps_avx(auVar138,auVar138,0x55);
                local_420 = auVar140;
                local_410 = vshufps_avx(auVar138,auVar138,0xaa);
                fStack_3fc = local_400;
                fStack_3f8 = local_400;
                fStack_3f4 = local_400;
                uStack_3ec = local_3f0;
                uStack_3e8 = local_3f0;
                uStack_3e4 = local_3f0;
                local_3e0 = local_580._0_8_;
                uStack_3d8 = local_580._8_8_;
                local_3d0 = local_560._0_16_;
                vpcmpeqd_avx2(ZEXT1632(local_560._0_16_),ZEXT1632(local_560._0_16_));
                uStack_3bc = (local_710.context)->instID[0];
                local_3c0 = uStack_3bc;
                uStack_3b8 = uStack_3bc;
                uStack_3b4 = uStack_3bc;
                uStack_3b0 = (local_710.context)->instPrimID[0];
                uStack_3ac = uStack_3b0;
                uStack_3a8 = uStack_3b0;
                uStack_3a4 = uStack_3b0;
                local_7a0 = local_5a0._0_16_;
                local_710.valid = (int *)local_7a0;
                local_710.geometryUserPtr = pGVar71->userPtr;
                local_710.hit = (RTCHitN *)&local_430;
                local_710.N = 4;
                local_710.ray = (RTCRayN *)ray;
                if (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar165 = ZEXT1664(auVar159);
                  auVar204 = ZEXT1664(auVar204._0_16_);
                  (*pGVar71->intersectionFilterN)(&local_710);
                  auVar150 = ZEXT3264(local_600);
                  auVar143 = ZEXT3264(local_6e0);
                  auVar119 = ZEXT3264(local_660);
                  auVar202 = ZEXT3264(local_780);
                  auVar192 = ZEXT3264(local_6a0);
                  pre = local_790;
                  uVar74 = local_6c0;
                  uVar214 = uStack_6b8;
                  uVar215 = uStack_6b0;
                  uVar216 = uStack_6a8;
                }
                if (local_7a0 == (undefined1  [16])0x0) {
                  auVar140 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                  auVar140 = auVar140 ^ auVar138;
                }
                else {
                  p_Var7 = context->args->filter;
                  auVar138 = vpcmpeqd_avx(auVar140,auVar140);
                  if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar71->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    auVar165 = ZEXT1664(auVar165._0_16_);
                    auVar204 = ZEXT1664(auVar204._0_16_);
                    (*p_Var7)(&local_710);
                    auVar150 = ZEXT3264(local_600);
                    auVar143 = ZEXT3264(local_6e0);
                    auVar119 = ZEXT3264(local_660);
                    auVar202 = ZEXT3264(local_780);
                    auVar192 = ZEXT3264(local_6a0);
                    auVar138 = vpcmpeqd_avx(auVar138,auVar138);
                    pre = local_790;
                    uVar74 = local_6c0;
                    uVar214 = uStack_6b8;
                    uVar215 = uStack_6b0;
                    uVar216 = uStack_6a8;
                  }
                  auVar139 = vpcmpeqd_avx(local_7a0,_DAT_01f45a50);
                  auVar140 = auVar139 ^ auVar138;
                  if (local_7a0 != (undefined1  [16])0x0) {
                    auVar139 = auVar139 ^ auVar138;
                    auVar138 = vmaskmovps_avx(auVar139,*(undefined1 (*) [16])local_710.hit);
                    *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar138;
                    auVar138 = vmaskmovps_avx(auVar139,*(undefined1 (*) [16])(local_710.hit + 0x10))
                    ;
                    *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar138;
                    auVar138 = vmaskmovps_avx(auVar139,*(undefined1 (*) [16])(local_710.hit + 0x20))
                    ;
                    *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar138;
                    auVar138 = vmaskmovps_avx(auVar139,*(undefined1 (*) [16])(local_710.hit + 0x30))
                    ;
                    *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar138;
                    auVar138 = vmaskmovps_avx(auVar139,*(undefined1 (*) [16])(local_710.hit + 0x40))
                    ;
                    *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar138;
                    auVar138 = vmaskmovps_avx(auVar139,*(undefined1 (*) [16])(local_710.hit + 0x50))
                    ;
                    *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar138;
                    auVar138 = vmaskmovps_avx(auVar139,*(undefined1 (*) [16])(local_710.hit + 0x60))
                    ;
                    *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar138;
                    auVar138 = vmaskmovps_avx(auVar139,*(undefined1 (*) [16])(local_710.hit + 0x70))
                    ;
                    *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar138;
                    auVar138 = vmaskmovps_avx(auVar139,*(undefined1 (*) [16])(local_710.hit + 0x80))
                    ;
                    *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar138;
                  }
                }
                auVar160 = local_4a0;
                auVar205 = auVar143._0_32_;
                auVar197 = auVar119._0_32_;
                auVar208 = auVar150._0_32_;
                auVar105._8_8_ = 0x100000001;
                auVar105._0_8_ = 0x100000001;
                if ((auVar105 & auVar140) == (undefined1  [16])0x0) {
                  *(undefined4 *)(ray + k * 4 + 0x80) = local_820._0_4_;
                }
                else {
                  local_820._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                  local_820._4_4_ = 0;
                  local_820._8_4_ = 0;
                  local_820._12_4_ = 0;
                }
                *(undefined4 *)(local_520 + uVar69 * 4) = 0;
                auStack_810 = auVar106._16_16_;
                auVar93._4_4_ = local_820._0_4_;
                auVar93._0_4_ = local_820._0_4_;
                auVar93._8_4_ = local_820._0_4_;
                auVar93._12_4_ = local_820._0_4_;
                auVar93._16_4_ = local_820._0_4_;
                auVar93._20_4_ = local_820._0_4_;
                auVar93._24_4_ = local_820._0_4_;
                auVar93._28_4_ = local_820._0_4_;
                auVar164 = vcmpps_avx(auVar160,auVar93,2);
                auVar106 = vandps_avx(auVar164,local_520);
                local_520 = local_520 & auVar164;
                if ((((((((local_520 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (local_520 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (local_520 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(local_520 >> 0x7f,0) == '\0') &&
                      (local_520 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(local_520 >> 0xbf,0) == '\0') &&
                    (local_520 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < local_520[0x1f]) break;
                auVar118._8_4_ = 0x7f800000;
                auVar118._0_8_ = 0x7f8000007f800000;
                auVar118._12_4_ = 0x7f800000;
                auVar118._16_4_ = 0x7f800000;
                auVar118._20_4_ = 0x7f800000;
                auVar118._24_4_ = 0x7f800000;
                auVar118._28_4_ = 0x7f800000;
                auVar160 = vblendvps_avx(auVar118,auVar160,auVar106);
                auVar164 = vshufps_avx(auVar160,auVar160,0xb1);
                auVar164 = vminps_avx(auVar160,auVar164);
                auVar132 = vshufpd_avx(auVar164,auVar164,5);
                auVar164 = vminps_avx(auVar164,auVar132);
                auVar132 = vpermpd_avx2(auVar164,0x4e);
                auVar164 = vminps_avx(auVar164,auVar132);
                auVar164 = vcmpps_avx(auVar160,auVar164,0);
                auVar132 = auVar106 & auVar164;
                auVar160 = auVar106;
                if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar132 >> 0x7f,0) != '\0') ||
                      (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar132 >> 0xbf,0) != '\0') ||
                    (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar132[0x1f] < '\0') {
                  auVar160 = vandps_avx(auVar164,auVar106);
                }
                uVar65 = vmovmskps_avx(auVar160);
                uVar68 = 0;
                for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                  uVar68 = uVar68 + 1;
                }
                uVar69 = (ulong)uVar68;
                local_520 = auVar106;
              }
            }
          }
        }
        auVar119 = ZEXT3264(local_640);
        auVar143 = ZEXT3264(local_540);
      }
    }
    auVar150 = ZEXT3264(CONCAT428(fStack_5c4,
                                  CONCAT424(fStack_5c8,
                                            CONCAT420(fStack_5cc,
                                                      CONCAT416(fStack_5d0,
                                                                CONCAT412(fStack_5d4,
                                                                          CONCAT48(fStack_5d8,
                                                                                   CONCAT44(
                                                  fStack_5dc,local_5e0))))))));
    if (8 < iVar6) {
      local_2c0._4_4_ = iVar6;
      local_2c0._0_4_ = iVar6;
      local_2c0._8_4_ = iVar6;
      local_2c0._12_4_ = iVar6;
      local_2c0._16_4_ = iVar6;
      local_2c0._20_4_ = iVar6;
      local_2c0._24_4_ = iVar6;
      local_2c0._28_4_ = iVar6;
      local_300._4_4_ = fVar96;
      local_300._0_4_ = fVar96;
      fStack_2f8 = fVar96;
      fStack_2f4 = fVar96;
      fStack_2f0 = fVar96;
      fStack_2ec = fVar96;
      fStack_2e8 = fVar96;
      fStack_2e4 = fVar96;
      local_320 = (float)local_760._0_4_;
      fStack_31c = (float)local_760._0_4_;
      fStack_318 = (float)local_760._0_4_;
      fStack_314 = (float)local_760._0_4_;
      fStack_310 = (float)local_760._0_4_;
      fStack_30c = (float)local_760._0_4_;
      fStack_308 = (float)local_760._0_4_;
      uStack_304 = local_760._0_4_;
      local_340._4_4_ = 1.0 / (float)local_610._0_4_;
      local_340._0_4_ = local_340._4_4_;
      fStack_338 = (float)local_340._4_4_;
      fStack_334 = (float)local_340._4_4_;
      fStack_330 = (float)local_340._4_4_;
      fStack_32c = (float)local_340._4_4_;
      fStack_328 = (float)local_340._4_4_;
      fStack_324 = (float)local_340._4_4_;
      local_610._4_4_ = local_620._0_4_;
      local_610._0_4_ = local_620._0_4_;
      uStack_608 = local_620._0_4_;
      uStack_604 = local_620._0_4_;
      local_620._4_4_ = local_440._0_4_;
      local_620._0_4_ = local_440._0_4_;
      local_620._8_4_ = local_440._0_4_;
      local_620._12_4_ = local_440._0_4_;
      auVar179 = ZEXT3264(auVar197);
      uStack_6b8 = uVar214;
      local_6c0 = uVar74;
      fVar120 = (float)local_5c0;
      fVar94 = local_5c0._4_4_;
      fVar95 = (float)uStack_5b8;
      fVar96 = uStack_5b8._4_4_;
      fVar97 = (float)uStack_5b0;
      fVar98 = uStack_5b0._4_4_;
      fVar99 = (float)uStack_5a8;
      uVar72 = uStack_5a8._4_4_;
      local_6e0 = auVar205;
      uStack_6b0 = uVar215;
      uStack_6a8 = uVar216;
      local_660 = auVar197;
      local_600 = auVar208;
      for (lVar67 = 8; local_640 = auVar119._0_32_, lVar67 < iVar6; lVar67 = lVar67 + 8) {
        local_560 = *(undefined1 (*) [32])(bezier_basis0 + lVar67 * 4 + lVar73);
        auVar106 = *(undefined1 (*) [32])(lVar73 + 0x21fb768 + lVar67 * 4);
        local_760._0_32_ = *(undefined1 (*) [32])(lVar73 + 0x21fbbec + lVar67 * 4);
        pauVar1 = (undefined1 (*) [32])(lVar73 + 0x21fc070 + lVar67 * 4);
        auVar63 = *(undefined1 (*) [28])*pauVar1;
        auVar119._0_4_ = auVar150._0_4_ * *(float *)*pauVar1;
        auVar119._4_4_ = auVar150._4_4_ * *(float *)(*pauVar1 + 4);
        auVar119._8_4_ = auVar150._8_4_ * *(float *)(*pauVar1 + 8);
        auVar119._12_4_ = auVar150._12_4_ * *(float *)(*pauVar1 + 0xc);
        auVar119._16_4_ = auVar150._16_4_ * *(float *)(*pauVar1 + 0x10);
        auVar119._20_4_ = auVar150._20_4_ * *(float *)(*pauVar1 + 0x14);
        auVar119._28_36_ = auVar204._28_36_;
        auVar119._24_4_ = auVar150._24_4_ * *(float *)(*pauVar1 + 0x18);
        auVar204._0_4_ = fVar120 * *(float *)*pauVar1;
        auVar204._4_4_ = fVar94 * *(float *)(*pauVar1 + 4);
        auVar204._8_4_ = fVar95 * *(float *)(*pauVar1 + 8);
        auVar204._12_4_ = fVar96 * *(float *)(*pauVar1 + 0xc);
        auVar204._16_4_ = fVar97 * *(float *)(*pauVar1 + 0x10);
        auVar204._20_4_ = fVar98 * *(float *)(*pauVar1 + 0x14);
        auVar204._28_36_ = auVar165._28_36_;
        auVar204._24_4_ = fVar99 * *(float *)(*pauVar1 + 0x18);
        auVar140 = vfmadd231ps_fma(auVar119._0_32_,local_760._0_32_,local_260);
        auVar138 = vfmadd231ps_fma(auVar204._0_32_,local_760._0_32_,auVar143._0_32_);
        auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar106,auVar192._0_32_);
        auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar106,local_460);
        auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_560,auVar202._0_32_);
        auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),local_560,local_480);
        auVar160 = *(undefined1 (*) [32])(bezier_basis1 + lVar67 * 4 + lVar73);
        auVar164 = *(undefined1 (*) [32])(lVar73 + 0x21fdb88 + lVar67 * 4);
        auVar132 = *(undefined1 (*) [32])(lVar73 + 0x21fe00c + lVar67 * 4);
        pfVar2 = (float *)(lVar73 + 0x21fe490 + lVar67 * 4);
        fVar100 = *pfVar2;
        fVar183 = pfVar2[1];
        fVar184 = pfVar2[2];
        fVar185 = pfVar2[3];
        fVar193 = pfVar2[4];
        fVar194 = pfVar2[5];
        fVar195 = pfVar2[6];
        auVar165._0_4_ = auVar150._0_4_ * fVar100;
        auVar165._4_4_ = auVar150._4_4_ * fVar183;
        auVar165._8_4_ = auVar150._8_4_ * fVar184;
        auVar165._12_4_ = auVar150._12_4_ * fVar185;
        auVar165._16_4_ = auVar150._16_4_ * fVar193;
        auVar165._20_4_ = auVar150._20_4_ * fVar194;
        auVar165._28_36_ = auVar150._28_36_;
        auVar165._24_4_ = auVar150._24_4_ * fVar195;
        auVar31._4_4_ = fVar94 * fVar183;
        auVar31._0_4_ = fVar120 * fVar100;
        auVar31._8_4_ = fVar95 * fVar184;
        auVar31._12_4_ = fVar96 * fVar185;
        auVar31._16_4_ = fVar97 * fVar193;
        auVar31._20_4_ = fVar98 * fVar194;
        auVar31._24_4_ = fVar99 * fVar195;
        auVar31._28_4_ = uVar72;
        auVar139 = vfmadd231ps_fma(auVar165._0_32_,auVar132,local_260);
        auVar8 = vfmadd231ps_fma(auVar31,auVar132,auVar143._0_32_);
        auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar164,auVar192._0_32_);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar164,local_460);
        auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),auVar160,auVar202._0_32_);
        auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar160,local_480);
        local_5a0 = ZEXT1632(auVar139);
        local_2a0 = ZEXT1632(auVar140);
        auVar89 = vsubps_avx(local_5a0,local_2a0);
        local_580 = ZEXT1632(auVar8);
        local_280 = ZEXT1632(auVar138);
        auVar83 = vsubps_avx(local_580,local_280);
        auVar32._4_4_ = auVar89._4_4_ * auVar138._4_4_;
        auVar32._0_4_ = auVar89._0_4_ * auVar138._0_4_;
        auVar32._8_4_ = auVar89._8_4_ * auVar138._8_4_;
        auVar32._12_4_ = auVar89._12_4_ * auVar138._12_4_;
        auVar32._16_4_ = auVar89._16_4_ * 0.0;
        auVar32._20_4_ = auVar89._20_4_ * 0.0;
        auVar32._24_4_ = auVar89._24_4_ * 0.0;
        auVar32._28_4_ = local_260._28_4_;
        auVar165 = ZEXT3264(local_760._0_32_);
        fVar120 = auVar83._0_4_;
        auVar114._0_4_ = auVar140._0_4_ * fVar120;
        fVar94 = auVar83._4_4_;
        auVar114._4_4_ = auVar140._4_4_ * fVar94;
        fVar95 = auVar83._8_4_;
        auVar114._8_4_ = auVar140._8_4_ * fVar95;
        fVar96 = auVar83._12_4_;
        auVar114._12_4_ = auVar140._12_4_ * fVar96;
        fVar97 = auVar83._16_4_;
        auVar114._16_4_ = fVar97 * 0.0;
        fVar98 = auVar83._20_4_;
        auVar114._20_4_ = fVar98 * 0.0;
        fVar99 = auVar83._24_4_;
        auVar114._24_4_ = fVar99 * 0.0;
        auVar114._28_4_ = 0;
        auVar204 = ZEXT3264(*pauVar1);
        auVar91 = vsubps_avx(auVar32,auVar114);
        auVar33._4_4_ = auVar63._4_4_ * (float)local_c0._4_4_;
        auVar33._0_4_ = auVar63._0_4_ * (float)local_c0._0_4_;
        auVar33._8_4_ = auVar63._8_4_ * fStack_b8;
        auVar33._12_4_ = auVar63._12_4_ * fStack_b4;
        auVar33._16_4_ = auVar63._16_4_ * fStack_b0;
        auVar33._20_4_ = auVar63._20_4_ * fStack_ac;
        auVar33._24_4_ = auVar63._24_4_ * fStack_a8;
        auVar33._28_4_ = local_260._28_4_;
        auVar140 = vfmadd231ps_fma(auVar33,local_760._0_32_,auVar179._0_32_);
        auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),auVar106,local_80);
        auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),local_560,local_a0);
        auVar34._4_4_ = (float)local_c0._4_4_ * fVar183;
        auVar34._0_4_ = (float)local_c0._0_4_ * fVar100;
        auVar34._8_4_ = fStack_b8 * fVar184;
        auVar34._12_4_ = fStack_b4 * fVar185;
        auVar34._16_4_ = fStack_b0 * fVar193;
        auVar34._20_4_ = fStack_ac * fVar194;
        auVar34._24_4_ = fStack_a8 * fVar195;
        auVar34._28_4_ = uStack_a4;
        auVar138 = vfmadd231ps_fma(auVar34,auVar132,auVar179._0_32_);
        auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar164,local_80);
        auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar160,local_a0);
        auVar35._4_4_ = fVar94 * fVar94;
        auVar35._0_4_ = fVar120 * fVar120;
        auVar35._8_4_ = fVar95 * fVar95;
        auVar35._12_4_ = fVar96 * fVar96;
        auVar35._16_4_ = fVar97 * fVar97;
        auVar35._20_4_ = fVar98 * fVar98;
        auVar35._24_4_ = fVar99 * fVar99;
        auVar35._28_4_ = local_a0._28_4_;
        auVar139 = vfmadd231ps_fma(auVar35,auVar89,auVar89);
        auVar90 = ZEXT1632(auVar140);
        auVar170 = vmaxps_avx(auVar90,ZEXT1632(auVar138));
        auVar189._0_4_ = auVar170._0_4_ * auVar170._0_4_ * auVar139._0_4_;
        auVar189._4_4_ = auVar170._4_4_ * auVar170._4_4_ * auVar139._4_4_;
        auVar189._8_4_ = auVar170._8_4_ * auVar170._8_4_ * auVar139._8_4_;
        auVar189._12_4_ = auVar170._12_4_ * auVar170._12_4_ * auVar139._12_4_;
        auVar189._16_4_ = auVar170._16_4_ * auVar170._16_4_ * 0.0;
        auVar189._20_4_ = auVar170._20_4_ * auVar170._20_4_ * 0.0;
        auVar189._24_4_ = auVar170._24_4_ * auVar170._24_4_ * 0.0;
        auVar189._28_4_ = 0;
        auVar36._4_4_ = auVar91._4_4_ * auVar91._4_4_;
        auVar36._0_4_ = auVar91._0_4_ * auVar91._0_4_;
        auVar36._8_4_ = auVar91._8_4_ * auVar91._8_4_;
        auVar36._12_4_ = auVar91._12_4_ * auVar91._12_4_;
        auVar36._16_4_ = auVar91._16_4_ * auVar91._16_4_;
        auVar36._20_4_ = auVar91._20_4_ * auVar91._20_4_;
        auVar36._24_4_ = auVar91._24_4_ * auVar91._24_4_;
        auVar36._28_4_ = auVar91._28_4_;
        auVar170 = vcmpps_avx(auVar36,auVar189,2);
        local_1c0 = (int)lVar67;
        auVar190._4_4_ = local_1c0;
        auVar190._0_4_ = local_1c0;
        auVar190._8_4_ = local_1c0;
        auVar190._12_4_ = local_1c0;
        auVar190._16_4_ = local_1c0;
        auVar190._20_4_ = local_1c0;
        auVar190._24_4_ = local_1c0;
        auVar190._28_4_ = local_1c0;
        auVar91 = vpor_avx2(auVar190,_DAT_01fb4ba0);
        auVar13 = vpcmpgtd_avx2(local_2c0,auVar91);
        auVar91 = auVar13 & auVar170;
        fVar120 = (float)local_5c0;
        fVar94 = local_5c0._4_4_;
        fVar95 = (float)uStack_5b8;
        fVar96 = uStack_5b8._4_4_;
        fVar97 = (float)uStack_5b0;
        fVar98 = uStack_5b0._4_4_;
        fVar99 = (float)uStack_5a8;
        uVar72 = uStack_5a8._4_4_;
        if ((((((((auVar91 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar91 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar91 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar91 >> 0x7f,0) == '\0') &&
              (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar91 >> 0xbf,0) == '\0') &&
            (auVar91 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar91[0x1f]) {
          auVar119 = ZEXT3264(local_640);
          auVar150 = ZEXT3264(CONCAT428(fStack_5c4,
                                        CONCAT424(fStack_5c8,
                                                  CONCAT420(fStack_5cc,
                                                            CONCAT416(fStack_5d0,
                                                                      CONCAT412(fStack_5d4,
                                                                                CONCAT48(fStack_5d8,
                                                                                         CONCAT44(
                                                  fStack_5dc,local_5e0))))))));
          auVar192 = ZEXT3264(local_6a0);
          auVar202 = ZEXT3264(local_780);
          auVar179 = ZEXT3264(local_660);
        }
        else {
          local_2e0 = vandps_avx(auVar13,auVar170);
          auVar37._4_4_ = local_6c0._4_4_ * fVar183;
          auVar37._0_4_ = (float)local_6c0 * fVar100;
          auVar37._8_4_ = (float)uStack_6b8 * fVar184;
          auVar37._12_4_ = uStack_6b8._4_4_ * fVar185;
          auVar37._16_4_ = (float)uStack_6b0 * fVar193;
          auVar37._20_4_ = uStack_6b0._4_4_ * fVar194;
          auVar37._24_4_ = (float)uStack_6a8 * fVar195;
          auVar37._28_4_ = auVar170._28_4_;
          auVar140 = vfmadd213ps_fma(auVar132,local_600,auVar37);
          auVar140 = vfmadd213ps_fma(auVar164,local_4c0,ZEXT1632(auVar140));
          auVar140 = vfmadd132ps_fma(auVar160,ZEXT1632(auVar140),local_6e0);
          auVar38._4_4_ = local_6c0._4_4_ * auVar63._4_4_;
          auVar38._0_4_ = (float)local_6c0 * auVar63._0_4_;
          auVar38._8_4_ = (float)uStack_6b8 * auVar63._8_4_;
          auVar38._12_4_ = uStack_6b8._4_4_ * auVar63._12_4_;
          auVar38._16_4_ = (float)uStack_6b0 * auVar63._16_4_;
          auVar38._20_4_ = uStack_6b0._4_4_ * auVar63._20_4_;
          auVar38._24_4_ = (float)uStack_6a8 * auVar63._24_4_;
          auVar38._28_4_ = auVar170._28_4_;
          auVar139 = vfmadd213ps_fma(local_760._0_32_,local_600,auVar38);
          auVar139 = vfmadd213ps_fma(auVar106,local_4c0,ZEXT1632(auVar139));
          auVar106 = *(undefined1 (*) [32])(lVar73 + 0x21fc4f4 + lVar67 * 4);
          auVar160 = *(undefined1 (*) [32])(lVar73 + 0x21fc978 + lVar67 * 4);
          auVar164 = *(undefined1 (*) [32])(lVar73 + 0x21fcdfc + lVar67 * 4);
          pfVar2 = (float *)(lVar73 + 0x21fd280 + lVar67 * 4);
          fVar100 = *pfVar2;
          fVar183 = pfVar2[1];
          fVar184 = pfVar2[2];
          fVar185 = pfVar2[3];
          fVar193 = pfVar2[4];
          fVar194 = pfVar2[5];
          fVar195 = pfVar2[6];
          auVar181._0_4_ = fVar100 * local_5e0;
          auVar181._4_4_ = fVar183 * fStack_5dc;
          auVar181._8_4_ = fVar184 * fStack_5d8;
          auVar181._12_4_ = fVar185 * fStack_5d4;
          auVar181._16_4_ = fVar193 * fStack_5d0;
          auVar181._20_4_ = fVar194 * fStack_5cc;
          auVar181._24_4_ = fVar195 * fStack_5c8;
          auVar181._28_4_ = 0;
          auVar39._4_4_ = local_5c0._4_4_ * fVar183;
          auVar39._0_4_ = (float)local_5c0 * fVar100;
          auVar39._8_4_ = (float)uStack_5b8 * fVar184;
          auVar39._12_4_ = uStack_5b8._4_4_ * fVar185;
          auVar39._16_4_ = (float)uStack_5b0 * fVar193;
          auVar39._20_4_ = uStack_5b0._4_4_ * fVar194;
          auVar39._24_4_ = (float)uStack_5a8 * fVar195;
          auVar39._28_4_ = *(undefined4 *)(*pauVar1 + 0x1c);
          auVar40._4_4_ = local_6c0._4_4_ * fVar183;
          auVar40._0_4_ = (float)local_6c0 * fVar100;
          auVar40._8_4_ = (float)uStack_6b8 * fVar184;
          auVar40._12_4_ = uStack_6b8._4_4_ * fVar185;
          auVar40._16_4_ = (float)uStack_6b0 * fVar193;
          auVar40._20_4_ = uStack_6b0._4_4_ * fVar194;
          auVar40._24_4_ = (float)uStack_6a8 * fVar195;
          auVar40._28_4_ = pfVar2[7];
          auVar8 = vfmadd231ps_fma(auVar181,auVar164,local_260);
          auVar9 = vfmadd231ps_fma(auVar39,auVar164,local_540);
          auVar78 = vfmadd231ps_fma(auVar40,local_600,auVar164);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar160,local_6a0);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar160,local_460);
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar160,local_4c0);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar106,local_780);
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar9),auVar106,local_480);
          auVar78 = vfmadd231ps_fma(ZEXT1632(auVar78),auVar106,local_6e0);
          pfVar2 = (float *)(lVar73 + 0x21ff6a0 + lVar67 * 4);
          fVar100 = *pfVar2;
          fVar183 = pfVar2[1];
          fVar184 = pfVar2[2];
          fVar185 = pfVar2[3];
          fVar193 = pfVar2[4];
          fVar194 = pfVar2[5];
          fVar195 = pfVar2[6];
          auVar41._4_4_ = fStack_5dc * fVar183;
          auVar41._0_4_ = local_5e0 * fVar100;
          auVar41._8_4_ = fStack_5d8 * fVar184;
          auVar41._12_4_ = fStack_5d4 * fVar185;
          auVar41._16_4_ = fStack_5d0 * fVar193;
          auVar41._20_4_ = fStack_5cc * fVar194;
          auVar41._24_4_ = fStack_5c8 * fVar195;
          auVar41._28_4_ = auVar89._28_4_;
          auVar42._4_4_ = local_5c0._4_4_ * fVar183;
          auVar42._0_4_ = (float)local_5c0 * fVar100;
          auVar42._8_4_ = (float)uStack_5b8 * fVar184;
          auVar42._12_4_ = uStack_5b8._4_4_ * fVar185;
          auVar42._16_4_ = (float)uStack_5b0 * fVar193;
          auVar42._20_4_ = uStack_5b0._4_4_ * fVar194;
          auVar42._24_4_ = (float)uStack_5a8 * fVar195;
          auVar42._28_4_ = uStack_5a8._4_4_;
          auVar43._4_4_ = fVar183 * local_6c0._4_4_;
          auVar43._0_4_ = fVar100 * (float)local_6c0;
          auVar43._8_4_ = fVar184 * (float)uStack_6b8;
          auVar43._12_4_ = fVar185 * uStack_6b8._4_4_;
          auVar43._16_4_ = fVar193 * (float)uStack_6b0;
          auVar43._20_4_ = fVar194 * uStack_6b0._4_4_;
          auVar43._24_4_ = fVar195 * (float)uStack_6a8;
          auVar43._28_4_ = pfVar2[7];
          auVar106 = *(undefined1 (*) [32])(lVar73 + 0x21ff21c + lVar67 * 4);
          auVar77 = vfmadd231ps_fma(auVar41,auVar106,local_260);
          auVar121 = vfmadd231ps_fma(auVar42,auVar106,local_540);
          auVar102 = vfmadd231ps_fma(auVar43,auVar106,local_600);
          auVar106 = *(undefined1 (*) [32])(lVar73 + 0x21fed98 + lVar67 * 4);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar106,local_6a0);
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar106,local_460);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar106,local_4c0);
          auVar106 = *(undefined1 (*) [32])(lVar73 + 0x21fe914 + lVar67 * 4);
          auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar106,local_780);
          auVar121 = vfmadd231ps_fma(ZEXT1632(auVar121),auVar106,local_480);
          auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),local_6e0,auVar106);
          auVar191._8_4_ = 0x7fffffff;
          auVar191._0_8_ = 0x7fffffff7fffffff;
          auVar191._12_4_ = 0x7fffffff;
          auVar191._16_4_ = 0x7fffffff;
          auVar191._20_4_ = 0x7fffffff;
          auVar191._24_4_ = 0x7fffffff;
          auVar191._28_4_ = 0x7fffffff;
          auVar106 = vandps_avx(ZEXT1632(auVar8),auVar191);
          auVar160 = vandps_avx(ZEXT1632(auVar9),auVar191);
          auVar160 = vmaxps_avx(auVar106,auVar160);
          auVar106 = vandps_avx(ZEXT1632(auVar78),auVar191);
          auVar106 = vmaxps_avx(auVar160,auVar106);
          auVar106 = vcmpps_avx(auVar106,_local_300,1);
          auVar164 = vblendvps_avx(ZEXT1632(auVar8),auVar89,auVar106);
          auVar132 = vblendvps_avx(ZEXT1632(auVar9),auVar83,auVar106);
          auVar106 = vandps_avx(ZEXT1632(auVar77),auVar191);
          auVar160 = vandps_avx(ZEXT1632(auVar121),auVar191);
          auVar160 = vmaxps_avx(auVar106,auVar160);
          auVar106 = vandps_avx(auVar191,ZEXT1632(auVar102));
          auVar106 = vmaxps_avx(auVar160,auVar106);
          auVar160 = vcmpps_avx(auVar106,_local_300,1);
          auVar106 = vblendvps_avx(ZEXT1632(auVar77),auVar89,auVar160);
          auVar160 = vblendvps_avx(ZEXT1632(auVar121),auVar83,auVar160);
          auVar139 = vfmadd213ps_fma(local_560,local_6e0,ZEXT1632(auVar139));
          auVar8 = vfmadd213ps_fma(auVar164,auVar164,ZEXT832(0) << 0x20);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar132,auVar132);
          auVar170 = vrsqrtps_avx(ZEXT1632(auVar8));
          fVar100 = auVar170._0_4_;
          fVar183 = auVar170._4_4_;
          fVar184 = auVar170._8_4_;
          fVar185 = auVar170._12_4_;
          fVar193 = auVar170._16_4_;
          fVar194 = auVar170._20_4_;
          fVar195 = auVar170._24_4_;
          auVar44._4_4_ = fVar183 * fVar183 * fVar183 * auVar8._4_4_ * -0.5;
          auVar44._0_4_ = fVar100 * fVar100 * fVar100 * auVar8._0_4_ * -0.5;
          auVar44._8_4_ = fVar184 * fVar184 * fVar184 * auVar8._8_4_ * -0.5;
          auVar44._12_4_ = fVar185 * fVar185 * fVar185 * auVar8._12_4_ * -0.5;
          auVar44._16_4_ = fVar193 * fVar193 * fVar193 * -0.0;
          auVar44._20_4_ = fVar194 * fVar194 * fVar194 * -0.0;
          auVar44._24_4_ = fVar195 * fVar195 * fVar195 * -0.0;
          auVar44._28_4_ = 0;
          auVar210._8_4_ = 0x3fc00000;
          auVar210._0_8_ = 0x3fc000003fc00000;
          auVar210._12_4_ = 0x3fc00000;
          auVar210._16_4_ = 0x3fc00000;
          auVar210._20_4_ = 0x3fc00000;
          auVar210._24_4_ = 0x3fc00000;
          auVar210._28_4_ = 0x3fc00000;
          auVar8 = vfmadd231ps_fma(auVar44,auVar210,auVar170);
          fVar100 = auVar8._0_4_;
          fVar183 = auVar8._4_4_;
          auVar45._4_4_ = auVar132._4_4_ * fVar183;
          auVar45._0_4_ = auVar132._0_4_ * fVar100;
          fVar184 = auVar8._8_4_;
          auVar45._8_4_ = auVar132._8_4_ * fVar184;
          fVar185 = auVar8._12_4_;
          auVar45._12_4_ = auVar132._12_4_ * fVar185;
          auVar45._16_4_ = auVar132._16_4_ * 0.0;
          auVar45._20_4_ = auVar132._20_4_ * 0.0;
          auVar45._24_4_ = auVar132._24_4_ * 0.0;
          auVar45._28_4_ = auVar170._28_4_;
          auVar46._4_4_ = fVar183 * -auVar164._4_4_;
          auVar46._0_4_ = fVar100 * -auVar164._0_4_;
          auVar46._8_4_ = fVar184 * -auVar164._8_4_;
          auVar46._12_4_ = fVar185 * -auVar164._12_4_;
          auVar46._16_4_ = -auVar164._16_4_ * 0.0;
          auVar46._20_4_ = -auVar164._20_4_ * 0.0;
          auVar46._24_4_ = -auVar164._24_4_ * 0.0;
          auVar46._28_4_ = auVar132._28_4_;
          auVar8 = vfmadd213ps_fma(auVar106,auVar106,ZEXT832(0) << 0x20);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar160,auVar160);
          auVar164 = vrsqrtps_avx(ZEXT1632(auVar8));
          auVar47._28_4_ = auVar83._28_4_;
          auVar47._0_28_ =
               ZEXT1628(CONCAT412(fVar185 * 0.0,
                                  CONCAT48(fVar184 * 0.0,CONCAT44(fVar183 * 0.0,fVar100 * 0.0))));
          fVar100 = auVar164._0_4_;
          fVar183 = auVar164._4_4_;
          fVar184 = auVar164._8_4_;
          fVar185 = auVar164._12_4_;
          fVar193 = auVar164._16_4_;
          fVar194 = auVar164._20_4_;
          fVar195 = auVar164._24_4_;
          auVar48._4_4_ = fVar183 * fVar183 * fVar183 * auVar8._4_4_ * -0.5;
          auVar48._0_4_ = fVar100 * fVar100 * fVar100 * auVar8._0_4_ * -0.5;
          auVar48._8_4_ = fVar184 * fVar184 * fVar184 * auVar8._8_4_ * -0.5;
          auVar48._12_4_ = fVar185 * fVar185 * fVar185 * auVar8._12_4_ * -0.5;
          auVar48._16_4_ = fVar193 * fVar193 * fVar193 * -0.0;
          auVar48._20_4_ = fVar194 * fVar194 * fVar194 * -0.0;
          auVar48._24_4_ = fVar195 * fVar195 * fVar195 * -0.0;
          auVar48._28_4_ = 0;
          auVar8 = vfmadd231ps_fma(auVar48,auVar210,auVar164);
          fVar100 = auVar8._0_4_;
          fVar183 = auVar8._4_4_;
          auVar49._4_4_ = auVar160._4_4_ * fVar183;
          auVar49._0_4_ = auVar160._0_4_ * fVar100;
          fVar184 = auVar8._8_4_;
          auVar49._8_4_ = auVar160._8_4_ * fVar184;
          fVar185 = auVar8._12_4_;
          auVar49._12_4_ = auVar160._12_4_ * fVar185;
          auVar49._16_4_ = auVar160._16_4_ * 0.0;
          auVar49._20_4_ = auVar160._20_4_ * 0.0;
          auVar49._24_4_ = auVar160._24_4_ * 0.0;
          auVar49._28_4_ = 0;
          auVar50._4_4_ = fVar183 * -auVar106._4_4_;
          auVar50._0_4_ = fVar100 * -auVar106._0_4_;
          auVar50._8_4_ = fVar184 * -auVar106._8_4_;
          auVar50._12_4_ = fVar185 * -auVar106._12_4_;
          auVar50._16_4_ = -auVar106._16_4_ * 0.0;
          auVar50._20_4_ = -auVar106._20_4_ * 0.0;
          auVar50._24_4_ = -auVar106._24_4_ * 0.0;
          auVar50._28_4_ = auVar164._28_4_;
          auVar51._28_4_ = 0xbf000000;
          auVar51._0_28_ =
               ZEXT1628(CONCAT412(fVar185 * 0.0,
                                  CONCAT48(fVar184 * 0.0,CONCAT44(fVar183 * 0.0,fVar100 * 0.0))));
          auVar8 = vfmadd213ps_fma(auVar45,auVar90,local_2a0);
          auVar9 = vfmadd213ps_fma(auVar46,auVar90,local_280);
          auVar78 = vfmadd213ps_fma(auVar47,auVar90,ZEXT1632(auVar139));
          auVar103 = vfnmadd213ps_fma(auVar45,auVar90,local_2a0);
          auVar77 = vfmadd213ps_fma(auVar49,ZEXT1632(auVar138),local_5a0);
          auVar134 = vfnmadd213ps_fma(auVar46,auVar90,local_280);
          auVar106 = ZEXT1632(auVar138);
          auVar121 = vfmadd213ps_fma(auVar50,auVar106,local_580);
          auVar101 = vfnmadd231ps_fma(ZEXT1632(auVar139),auVar90,auVar47);
          auVar139 = vfmadd213ps_fma(auVar51,auVar106,ZEXT1632(auVar140));
          auVar145 = vfnmadd213ps_fma(auVar49,auVar106,local_5a0);
          auVar75 = vfnmadd213ps_fma(auVar50,auVar106,local_580);
          auVar144 = vfnmadd231ps_fma(ZEXT1632(auVar140),ZEXT1632(auVar138),auVar51);
          auVar106 = vsubps_avx(ZEXT1632(auVar121),ZEXT1632(auVar134));
          auVar160 = vsubps_avx(ZEXT1632(auVar139),ZEXT1632(auVar101));
          auVar171._0_4_ = auVar106._0_4_ * auVar101._0_4_;
          auVar171._4_4_ = auVar106._4_4_ * auVar101._4_4_;
          auVar171._8_4_ = auVar106._8_4_ * auVar101._8_4_;
          auVar171._12_4_ = auVar106._12_4_ * auVar101._12_4_;
          auVar171._16_4_ = auVar106._16_4_ * 0.0;
          auVar171._20_4_ = auVar106._20_4_ * 0.0;
          auVar171._24_4_ = auVar106._24_4_ * 0.0;
          auVar171._28_4_ = 0;
          auVar102 = vfmsub231ps_fma(auVar171,ZEXT1632(auVar134),auVar160);
          auVar52._4_4_ = auVar103._4_4_ * auVar160._4_4_;
          auVar52._0_4_ = auVar103._0_4_ * auVar160._0_4_;
          auVar52._8_4_ = auVar103._8_4_ * auVar160._8_4_;
          auVar52._12_4_ = auVar103._12_4_ * auVar160._12_4_;
          auVar52._16_4_ = auVar160._16_4_ * 0.0;
          auVar52._20_4_ = auVar160._20_4_ * 0.0;
          auVar52._24_4_ = auVar160._24_4_ * 0.0;
          auVar52._28_4_ = auVar160._28_4_;
          auVar89 = ZEXT1632(auVar103);
          auVar160 = vsubps_avx(ZEXT1632(auVar77),auVar89);
          auVar91 = ZEXT1632(auVar101);
          auVar140 = vfmsub231ps_fma(auVar52,auVar91,auVar160);
          auVar53._4_4_ = auVar134._4_4_ * auVar160._4_4_;
          auVar53._0_4_ = auVar134._0_4_ * auVar160._0_4_;
          auVar53._8_4_ = auVar134._8_4_ * auVar160._8_4_;
          auVar53._12_4_ = auVar134._12_4_ * auVar160._12_4_;
          auVar53._16_4_ = auVar160._16_4_ * 0.0;
          auVar53._20_4_ = auVar160._20_4_ * 0.0;
          auVar53._24_4_ = auVar160._24_4_ * 0.0;
          auVar53._28_4_ = auVar160._28_4_;
          auVar103 = vfmsub231ps_fma(auVar53,auVar89,auVar106);
          auVar140 = vfmadd231ps_fma(ZEXT1632(auVar103),ZEXT832(0) << 0x20,ZEXT1632(auVar140));
          auVar140 = vfmadd231ps_fma(ZEXT1632(auVar140),ZEXT832(0) << 0x20,ZEXT1632(auVar102));
          auVar13 = vcmpps_avx(ZEXT1632(auVar140),ZEXT832(0) << 0x20,2);
          local_760._0_32_ = vblendvps_avx(ZEXT1632(auVar145),ZEXT1632(auVar8),auVar13);
          auVar106 = vblendvps_avx(ZEXT1632(auVar75),ZEXT1632(auVar9),auVar13);
          auVar160 = vblendvps_avx(ZEXT1632(auVar144),ZEXT1632(auVar78),auVar13);
          auVar164 = vblendvps_avx(auVar89,ZEXT1632(auVar77),auVar13);
          auVar132 = vblendvps_avx(ZEXT1632(auVar134),ZEXT1632(auVar121),auVar13);
          auVar170 = vblendvps_avx(auVar91,ZEXT1632(auVar139),auVar13);
          auVar89 = vblendvps_avx(ZEXT1632(auVar77),auVar89,auVar13);
          auVar83 = vblendvps_avx(ZEXT1632(auVar121),ZEXT1632(auVar134),auVar13);
          auVar140 = vpackssdw_avx(local_2e0._0_16_,local_2e0._16_16_);
          auVar91 = vblendvps_avx(ZEXT1632(auVar139),auVar91,auVar13);
          auVar89 = vsubps_avx(auVar89,local_760._0_32_);
          auVar83 = vsubps_avx(auVar83,auVar106);
          auVar12 = vsubps_avx(auVar91,auVar160);
          auVar82 = vsubps_avx(local_760._0_32_,auVar164);
          auVar84 = vsubps_avx(auVar106,auVar132);
          auVar107 = vsubps_avx(auVar160,auVar170);
          auVar161._0_4_ = auVar12._0_4_ * local_760._0_4_;
          auVar161._4_4_ = auVar12._4_4_ * local_760._4_4_;
          auVar161._8_4_ = auVar12._8_4_ * local_760._8_4_;
          auVar161._12_4_ = auVar12._12_4_ * local_760._12_4_;
          auVar161._16_4_ = auVar12._16_4_ * local_760._16_4_;
          auVar161._20_4_ = auVar12._20_4_ * local_760._20_4_;
          auVar161._24_4_ = auVar12._24_4_ * local_760._24_4_;
          auVar161._28_4_ = 0;
          auVar139 = vfmsub231ps_fma(auVar161,auVar160,auVar89);
          auVar54._4_4_ = auVar89._4_4_ * auVar106._4_4_;
          auVar54._0_4_ = auVar89._0_4_ * auVar106._0_4_;
          auVar54._8_4_ = auVar89._8_4_ * auVar106._8_4_;
          auVar54._12_4_ = auVar89._12_4_ * auVar106._12_4_;
          auVar54._16_4_ = auVar89._16_4_ * auVar106._16_4_;
          auVar54._20_4_ = auVar89._20_4_ * auVar106._20_4_;
          auVar54._24_4_ = auVar89._24_4_ * auVar106._24_4_;
          auVar54._28_4_ = auVar91._28_4_;
          auVar8 = vfmsub231ps_fma(auVar54,local_760._0_32_,auVar83);
          auVar204 = ZEXT864(0) << 0x20;
          auVar139 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT832(0) << 0x20,ZEXT1632(auVar139));
          auVar162._0_4_ = auVar83._0_4_ * auVar160._0_4_;
          auVar162._4_4_ = auVar83._4_4_ * auVar160._4_4_;
          auVar162._8_4_ = auVar83._8_4_ * auVar160._8_4_;
          auVar162._12_4_ = auVar83._12_4_ * auVar160._12_4_;
          auVar162._16_4_ = auVar83._16_4_ * auVar160._16_4_;
          auVar162._20_4_ = auVar83._20_4_ * auVar160._20_4_;
          auVar162._24_4_ = auVar83._24_4_ * auVar160._24_4_;
          auVar162._28_4_ = 0;
          auVar8 = vfmsub231ps_fma(auVar162,auVar106,auVar12);
          auVar8 = vfmadd231ps_fma(ZEXT1632(auVar139),ZEXT832(0) << 0x20,ZEXT1632(auVar8));
          auVar163._0_4_ = auVar107._0_4_ * auVar164._0_4_;
          auVar163._4_4_ = auVar107._4_4_ * auVar164._4_4_;
          auVar163._8_4_ = auVar107._8_4_ * auVar164._8_4_;
          auVar163._12_4_ = auVar107._12_4_ * auVar164._12_4_;
          auVar163._16_4_ = auVar107._16_4_ * auVar164._16_4_;
          auVar163._20_4_ = auVar107._20_4_ * auVar164._20_4_;
          auVar163._24_4_ = auVar107._24_4_ * auVar164._24_4_;
          auVar163._28_4_ = 0;
          auVar139 = vfmsub231ps_fma(auVar163,auVar82,auVar170);
          auVar55._4_4_ = auVar84._4_4_ * auVar170._4_4_;
          auVar55._0_4_ = auVar84._0_4_ * auVar170._0_4_;
          auVar55._8_4_ = auVar84._8_4_ * auVar170._8_4_;
          auVar55._12_4_ = auVar84._12_4_ * auVar170._12_4_;
          auVar55._16_4_ = auVar84._16_4_ * auVar170._16_4_;
          auVar55._20_4_ = auVar84._20_4_ * auVar170._20_4_;
          auVar55._24_4_ = auVar84._24_4_ * auVar170._24_4_;
          auVar55._28_4_ = auVar170._28_4_;
          auVar9 = vfmsub231ps_fma(auVar55,auVar132,auVar107);
          auVar56._4_4_ = auVar82._4_4_ * auVar132._4_4_;
          auVar56._0_4_ = auVar82._0_4_ * auVar132._0_4_;
          auVar56._8_4_ = auVar82._8_4_ * auVar132._8_4_;
          auVar56._12_4_ = auVar82._12_4_ * auVar132._12_4_;
          auVar56._16_4_ = auVar82._16_4_ * auVar132._16_4_;
          auVar56._20_4_ = auVar82._20_4_ * auVar132._20_4_;
          auVar56._24_4_ = auVar82._24_4_ * auVar132._24_4_;
          auVar56._28_4_ = auVar132._28_4_;
          auVar78 = vfmsub231ps_fma(auVar56,auVar84,auVar164);
          auVar139 = vfmadd231ps_fma(ZEXT1632(auVar78),ZEXT832(0) << 0x20,ZEXT1632(auVar139));
          auVar9 = vfmadd231ps_fma(ZEXT1632(auVar139),ZEXT832(0) << 0x20,ZEXT1632(auVar9));
          auVar164 = vmaxps_avx(ZEXT1632(auVar8),ZEXT1632(auVar9));
          auVar164 = vcmpps_avx(auVar164,ZEXT832(0) << 0x20,2);
          auVar139 = vpackssdw_avx(auVar164._0_16_,auVar164._16_16_);
          auVar140 = vpand_avx(auVar139,auVar140);
          auVar164 = vpmovsxwd_avx2(auVar140);
          auVar165 = ZEXT3264(auVar164);
          if ((((((((auVar164 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar164 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar164 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar164 >> 0x7f,0) == '\0') &&
                (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar164 >> 0xbf,0) == '\0') &&
              (auVar164 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar164[0x1f]) {
LAB_0114f3b9:
            auVar142._8_8_ = uStack_4d8;
            auVar142._0_8_ = local_4e0;
            auVar142._16_8_ = uStack_4d0;
            auVar142._24_8_ = uStack_4c8;
          }
          else {
            auVar57._4_4_ = auVar83._4_4_ * auVar107._4_4_;
            auVar57._0_4_ = auVar83._0_4_ * auVar107._0_4_;
            auVar57._8_4_ = auVar83._8_4_ * auVar107._8_4_;
            auVar57._12_4_ = auVar83._12_4_ * auVar107._12_4_;
            auVar57._16_4_ = auVar83._16_4_ * auVar107._16_4_;
            auVar57._20_4_ = auVar83._20_4_ * auVar107._20_4_;
            auVar57._24_4_ = auVar83._24_4_ * auVar107._24_4_;
            auVar57._28_4_ = auVar164._28_4_;
            auVar121 = vfmsub231ps_fma(auVar57,auVar84,auVar12);
            auVar172._0_4_ = auVar82._0_4_ * auVar12._0_4_;
            auVar172._4_4_ = auVar82._4_4_ * auVar12._4_4_;
            auVar172._8_4_ = auVar82._8_4_ * auVar12._8_4_;
            auVar172._12_4_ = auVar82._12_4_ * auVar12._12_4_;
            auVar172._16_4_ = auVar82._16_4_ * auVar12._16_4_;
            auVar172._20_4_ = auVar82._20_4_ * auVar12._20_4_;
            auVar172._24_4_ = auVar82._24_4_ * auVar12._24_4_;
            auVar172._28_4_ = 0;
            auVar77 = vfmsub231ps_fma(auVar172,auVar89,auVar107);
            auVar58._4_4_ = auVar89._4_4_ * auVar84._4_4_;
            auVar58._0_4_ = auVar89._0_4_ * auVar84._0_4_;
            auVar58._8_4_ = auVar89._8_4_ * auVar84._8_4_;
            auVar58._12_4_ = auVar89._12_4_ * auVar84._12_4_;
            auVar58._16_4_ = auVar89._16_4_ * auVar84._16_4_;
            auVar58._20_4_ = auVar89._20_4_ * auVar84._20_4_;
            auVar58._24_4_ = auVar89._24_4_ * auVar84._24_4_;
            auVar58._28_4_ = auVar84._28_4_;
            auVar102 = vfmsub231ps_fma(auVar58,auVar82,auVar83);
            auVar139 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar77),ZEXT1632(auVar102));
            auVar78 = vfmadd231ps_fma(ZEXT1632(auVar139),ZEXT1632(auVar121),ZEXT832(0) << 0x20);
            auVar164 = vrcpps_avx(ZEXT1632(auVar78));
            auVar203._8_4_ = 0x3f800000;
            auVar203._0_8_ = 0x3f8000003f800000;
            auVar203._12_4_ = 0x3f800000;
            auVar203._16_4_ = 0x3f800000;
            auVar203._20_4_ = 0x3f800000;
            auVar203._24_4_ = 0x3f800000;
            auVar203._28_4_ = 0x3f800000;
            auVar204 = ZEXT3264(auVar203);
            auVar139 = vfnmadd213ps_fma(auVar164,ZEXT1632(auVar78),auVar203);
            auVar139 = vfmadd132ps_fma(ZEXT1632(auVar139),auVar164,auVar164);
            auVar59._4_4_ = auVar102._4_4_ * auVar160._4_4_;
            auVar59._0_4_ = auVar102._0_4_ * auVar160._0_4_;
            auVar59._8_4_ = auVar102._8_4_ * auVar160._8_4_;
            auVar59._12_4_ = auVar102._12_4_ * auVar160._12_4_;
            auVar59._16_4_ = auVar160._16_4_ * 0.0;
            auVar59._20_4_ = auVar160._20_4_ * 0.0;
            auVar59._24_4_ = auVar160._24_4_ * 0.0;
            auVar59._28_4_ = auVar160._28_4_;
            auVar77 = vfmadd231ps_fma(auVar59,ZEXT1632(auVar77),auVar106);
            auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),ZEXT1632(auVar121),local_760._0_32_);
            fVar100 = auVar139._0_4_;
            fVar183 = auVar139._4_4_;
            fVar184 = auVar139._8_4_;
            fVar185 = auVar139._12_4_;
            auVar164 = ZEXT1632(CONCAT412(fVar185 * auVar77._12_4_,
                                          CONCAT48(fVar184 * auVar77._8_4_,
                                                   CONCAT44(fVar183 * auVar77._4_4_,
                                                            fVar100 * auVar77._0_4_))));
            auVar165 = ZEXT3264(auVar164);
            uVar200 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar141._4_4_ = uVar200;
            auVar141._0_4_ = uVar200;
            auVar141._8_4_ = uVar200;
            auVar141._12_4_ = uVar200;
            auVar141._16_4_ = uVar200;
            auVar141._20_4_ = uVar200;
            auVar141._24_4_ = uVar200;
            auVar141._28_4_ = uVar200;
            auVar62._4_4_ = fStack_31c;
            auVar62._0_4_ = local_320;
            auVar62._8_4_ = fStack_318;
            auVar62._12_4_ = fStack_314;
            auVar62._16_4_ = fStack_310;
            auVar62._20_4_ = fStack_30c;
            auVar62._24_4_ = fStack_308;
            auVar62._28_4_ = uStack_304;
            auVar106 = vcmpps_avx(auVar62,auVar164,2);
            auVar160 = vcmpps_avx(auVar164,auVar141,2);
            auVar106 = vandps_avx(auVar160,auVar106);
            auVar139 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
            auVar140 = vpand_avx(auVar140,auVar139);
            auVar106 = vpmovsxwd_avx2(auVar140);
            if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar106 >> 0x7f,0) == '\0') &&
                  (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar106 >> 0xbf,0) == '\0') &&
                (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar106[0x1f]) goto LAB_0114f3b9;
            auVar106 = vcmpps_avx(ZEXT1632(auVar78),ZEXT832(0) << 0x20,4);
            auVar139 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
            auVar140 = vpand_avx(auVar140,auVar139);
            auVar106 = vpmovsxwd_avx2(auVar140);
            auVar142._8_8_ = uStack_4d8;
            auVar142._0_8_ = local_4e0;
            auVar142._16_8_ = uStack_4d0;
            auVar142._24_8_ = uStack_4c8;
            if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar106 >> 0x7f,0) != '\0') ||
                  (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar106 >> 0xbf,0) != '\0') ||
                (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar106[0x1f] < '\0') {
              auVar132 = ZEXT1632(CONCAT412(fVar185 * auVar8._12_4_,
                                            CONCAT48(fVar184 * auVar8._8_4_,
                                                     CONCAT44(fVar183 * auVar8._4_4_,
                                                              fVar100 * auVar8._0_4_))));
              auVar60._28_4_ = SUB84(uStack_4c8,4);
              auVar60._0_28_ =
                   ZEXT1628(CONCAT412(fVar185 * auVar9._12_4_,
                                      CONCAT48(fVar184 * auVar9._8_4_,
                                               CONCAT44(fVar183 * auVar9._4_4_,
                                                        fVar100 * auVar9._0_4_))));
              auVar182._8_4_ = 0x3f800000;
              auVar182._0_8_ = 0x3f8000003f800000;
              auVar182._12_4_ = 0x3f800000;
              auVar182._16_4_ = 0x3f800000;
              auVar182._20_4_ = 0x3f800000;
              auVar182._24_4_ = 0x3f800000;
              auVar182._28_4_ = 0x3f800000;
              auVar160 = vsubps_avx(auVar182,auVar132);
              local_640 = vblendvps_avx(auVar160,auVar132,auVar13);
              auVar160 = vsubps_avx(auVar182,auVar60);
              local_3a0 = vblendvps_avx(auVar160,auVar60,auVar13);
              local_380 = auVar164;
              auVar142 = auVar106;
            }
          }
          auVar202 = ZEXT3264(local_780);
          auVar192 = ZEXT3264(local_6a0);
          if ((((((((auVar142 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar142 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar142 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar142 >> 0x7f,0) == '\0') &&
                (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar142 >> 0xbf,0) == '\0') &&
              (auVar142 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar142[0x1f]) {
            auVar119 = ZEXT3264(local_640);
            auVar150 = ZEXT3264(CONCAT428(fStack_5c4,
                                          CONCAT424(fStack_5c8,
                                                    CONCAT420(fStack_5cc,
                                                              CONCAT416(fStack_5d0,
                                                                        CONCAT412(fStack_5d4,
                                                                                  CONCAT48(
                                                  fStack_5d8,CONCAT44(fStack_5dc,local_5e0))))))));
            auVar179 = ZEXT3264(local_660);
          }
          else {
            auVar106 = vsubps_avx(ZEXT1632(auVar138),auVar90);
            auVar140 = vfmadd213ps_fma(auVar106,local_640,auVar90);
            fVar100 = *(float *)((long)pre->ray_space + k * 4 + -0x10);
            auVar61._4_4_ = (auVar140._4_4_ + auVar140._4_4_) * fVar100;
            auVar61._0_4_ = (auVar140._0_4_ + auVar140._0_4_) * fVar100;
            auVar61._8_4_ = (auVar140._8_4_ + auVar140._8_4_) * fVar100;
            auVar61._12_4_ = (auVar140._12_4_ + auVar140._12_4_) * fVar100;
            auVar61._16_4_ = fVar100 * 0.0;
            auVar61._20_4_ = fVar100 * 0.0;
            auVar61._24_4_ = fVar100 * 0.0;
            auVar61._28_4_ = fVar100;
            auVar165 = ZEXT3264(local_380);
            auVar106 = vcmpps_avx(local_380,auVar61,6);
            auVar160 = auVar142 & auVar106;
            auVar179 = ZEXT3264(local_660);
            if ((((((((auVar160 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar160 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar160 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar160 >> 0x7f,0) != '\0') ||
                  (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar160 >> 0xbf,0) != '\0') ||
                (auVar160 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar160[0x1f] < '\0') {
              auVar115._8_4_ = 0xbf800000;
              auVar115._0_8_ = 0xbf800000bf800000;
              auVar115._12_4_ = 0xbf800000;
              auVar115._16_4_ = 0xbf800000;
              auVar115._20_4_ = 0xbf800000;
              auVar115._24_4_ = 0xbf800000;
              auVar115._28_4_ = 0xbf800000;
              auVar133._8_4_ = 0x40000000;
              auVar133._0_8_ = 0x4000000040000000;
              auVar133._12_4_ = 0x40000000;
              auVar133._16_4_ = 0x40000000;
              auVar133._20_4_ = 0x40000000;
              auVar133._24_4_ = 0x40000000;
              auVar133._28_4_ = 0x40000000;
              auVar140 = vfmadd213ps_fma(local_3a0,auVar133,auVar115);
              local_220 = local_640;
              local_3a0 = ZEXT1632(auVar140);
              auVar160 = local_3a0;
              local_200 = ZEXT1632(auVar140);
              local_1e0 = local_380;
              local_1bc = iVar6;
              local_1b0 = local_720._0_8_;
              uStack_1a8 = local_720._8_8_;
              local_1a0 = local_7b0;
              uStack_198 = uStack_7a8;
              local_190 = local_7c0;
              uStack_188 = uStack_7b8;
              local_180 = local_730;
              uStack_178 = uStack_728;
              pGVar71 = (context->scene->geometries).items[local_788].ptr;
              auVar119 = ZEXT3264(local_640);
              auVar150 = ZEXT3264(CONCAT428(fStack_5c4,
                                            CONCAT424(fStack_5c8,
                                                      CONCAT420(fStack_5cc,
                                                                CONCAT416(fStack_5d0,
                                                                          CONCAT412(fStack_5d4,
                                                                                    CONCAT48(
                                                  fStack_5d8,CONCAT44(fStack_5dc,local_5e0))))))));
              if ((pGVar71->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) goto LAB_0114f361;
              local_520 = vandps_avx(auVar106,auVar142);
              fVar120 = (float)local_1c0;
              local_140[0] = (fVar120 + local_640._0_4_ + 0.0) * (float)local_340._0_4_;
              local_140[1] = (fVar120 + local_640._4_4_ + 1.0) * (float)local_340._4_4_;
              local_140[2] = (fVar120 + local_640._8_4_ + 2.0) * fStack_338;
              local_140[3] = (fVar120 + local_640._12_4_ + 3.0) * fStack_334;
              fStack_130 = (fVar120 + local_640._16_4_ + 4.0) * fStack_330;
              fStack_12c = (fVar120 + local_640._20_4_ + 5.0) * fStack_32c;
              fStack_128 = (fVar120 + local_640._24_4_ + 6.0) * fStack_328;
              fStack_124 = fVar120 + local_640._28_4_ + 7.0;
              local_3a0._0_8_ = auVar140._0_8_;
              local_3a0._8_8_ = auVar140._8_8_;
              local_120 = local_3a0._0_8_;
              uStack_118 = local_3a0._8_8_;
              uStack_110 = 0;
              uStack_108 = 0;
              local_100 = local_380;
              auVar116._8_4_ = 0x7f800000;
              auVar116._0_8_ = 0x7f8000007f800000;
              auVar116._12_4_ = 0x7f800000;
              auVar116._16_4_ = 0x7f800000;
              auVar116._20_4_ = 0x7f800000;
              auVar116._24_4_ = 0x7f800000;
              auVar116._28_4_ = 0x7f800000;
              auVar106 = vblendvps_avx(auVar116,local_380,local_520);
              auVar164 = vshufps_avx(auVar106,auVar106,0xb1);
              auVar164 = vminps_avx(auVar106,auVar164);
              auVar132 = vshufpd_avx(auVar164,auVar164,5);
              auVar164 = vminps_avx(auVar164,auVar132);
              auVar132 = vpermpd_avx2(auVar164,0x4e);
              auVar164 = vminps_avx(auVar164,auVar132);
              auVar164 = vcmpps_avx(auVar106,auVar164,0);
              auVar132 = local_520 & auVar164;
              auVar106 = local_520;
              if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar132 >> 0x7f,0) != '\0') ||
                    (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar132 >> 0xbf,0) != '\0') ||
                  (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar132[0x1f] < '\0') {
                auVar106 = vandps_avx(auVar164,local_520);
              }
              uVar65 = vmovmskps_avx(auVar106);
              uVar68 = 0;
              for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                uVar68 = uVar68 + 1;
              }
              uVar69 = (ulong)uVar68;
              local_3a0 = auVar160;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar71->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar120 = local_140[uVar69];
                uVar72 = *(undefined4 *)((long)&local_120 + uVar69 * 4);
                fVar95 = 1.0 - fVar120;
                fVar94 = fVar95 * fVar95 * -3.0;
                auVar140 = vfmadd231ss_fma(ZEXT416((uint)(fVar95 * fVar95)),
                                           ZEXT416((uint)(fVar120 * fVar95)),ZEXT416(0xc0000000));
                auVar138 = vfmsub132ss_fma(ZEXT416((uint)(fVar120 * fVar95)),
                                           ZEXT416((uint)(fVar120 * fVar120)),ZEXT416(0x40000000));
                fVar95 = auVar140._0_4_ * 3.0;
                fVar96 = auVar138._0_4_ * 3.0;
                fVar97 = fVar120 * fVar120 * 3.0;
                auVar157._0_4_ = fVar97 * (float)local_730._0_4_;
                auVar157._4_4_ = fVar97 * (float)local_730._4_4_;
                auVar157._8_4_ = fVar97 * (float)uStack_728;
                auVar157._12_4_ = fVar97 * uStack_728._4_4_;
                auVar165 = ZEXT1664(auVar157);
                auVar124._4_4_ = fVar96;
                auVar124._0_4_ = fVar96;
                auVar124._8_4_ = fVar96;
                auVar124._12_4_ = fVar96;
                auVar140 = vfmadd132ps_fma(auVar124,auVar157,auVar10);
                auVar137._4_4_ = fVar95;
                auVar137._0_4_ = fVar95;
                auVar137._8_4_ = fVar95;
                auVar137._12_4_ = fVar95;
                auVar140 = vfmadd132ps_fma(auVar137,auVar140,auVar76);
                auVar125._4_4_ = fVar94;
                auVar125._0_4_ = fVar94;
                auVar125._8_4_ = fVar94;
                auVar125._12_4_ = fVar94;
                auVar140 = vfmadd132ps_fma(auVar125,auVar140,local_720);
                *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + uVar69 * 4);
                *(int *)(ray + k * 4 + 0xc0) = auVar140._0_4_;
                uVar200 = vextractps_avx(auVar140,1);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar200;
                uVar200 = vextractps_avx(auVar140,2);
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar200;
                *(float *)(ray + k * 4 + 0xf0) = fVar120;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar72;
                *(int *)(ray + k * 4 + 0x110) = (int)local_668;
                *(int *)(ray + k * 4 + 0x120) = (int)local_788;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                auVar140 = *local_670;
                local_840 = ZEXT432(*(uint *)(ray + k * 4 + 0x80));
                local_760._0_8_ = pGVar71;
                while( true ) {
                  auVar106 = local_840;
                  local_400 = local_140[uVar69];
                  local_3f0 = *(undefined4 *)((long)&local_120 + uVar69 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_100 + uVar69 * 4);
                  fVar95 = 1.0 - local_400;
                  auVar139 = vfmadd231ss_fma(ZEXT416((uint)(fVar95 * fVar95)),
                                             ZEXT416((uint)(local_400 * fVar95)),ZEXT416(0xc0000000)
                                            );
                  auVar138 = vfmsub132ss_fma(ZEXT416((uint)(local_400 * fVar95)),
                                             ZEXT416((uint)(local_400 * local_400)),
                                             ZEXT416(0x40000000));
                  fVar120 = auVar138._0_4_ * 3.0;
                  fVar94 = local_400 * local_400 * 3.0;
                  auVar158._0_4_ = fVar94 * (float)local_730._0_4_;
                  auVar158._4_4_ = fVar94 * (float)local_730._4_4_;
                  auVar158._8_4_ = fVar94 * (float)uStack_728;
                  auVar158._12_4_ = fVar94 * uStack_728._4_4_;
                  auVar165 = ZEXT1664(auVar158);
                  auVar126._4_4_ = fVar120;
                  auVar126._0_4_ = fVar120;
                  auVar126._8_4_ = fVar120;
                  auVar126._12_4_ = fVar120;
                  auVar138 = vfmadd132ps_fma(auVar126,auVar158,auVar10);
                  fVar120 = auVar139._0_4_ * 3.0;
                  auVar146._4_4_ = fVar120;
                  auVar146._0_4_ = fVar120;
                  auVar146._8_4_ = fVar120;
                  auVar146._12_4_ = fVar120;
                  auVar138 = vfmadd132ps_fma(auVar146,auVar138,auVar76);
                  fVar120 = fVar95 * fVar95 * -3.0;
                  local_710.context = context->user;
                  auVar127._4_4_ = fVar120;
                  auVar127._0_4_ = fVar120;
                  auVar127._8_4_ = fVar120;
                  auVar127._12_4_ = fVar120;
                  auVar139 = vfmadd132ps_fma(auVar127,auVar138,local_720);
                  local_430 = auVar139._0_4_;
                  uStack_42c = local_430;
                  uStack_428 = local_430;
                  uStack_424 = local_430;
                  auVar138 = vshufps_avx(auVar139,auVar139,0x55);
                  local_420 = auVar138;
                  local_410 = vshufps_avx(auVar139,auVar139,0xaa);
                  fStack_3fc = local_400;
                  fStack_3f8 = local_400;
                  fStack_3f4 = local_400;
                  uStack_3ec = local_3f0;
                  uStack_3e8 = local_3f0;
                  uStack_3e4 = local_3f0;
                  local_3e0 = local_620._0_8_;
                  uStack_3d8 = local_620._8_8_;
                  local_3d0 = _local_610;
                  vpcmpeqd_avx2(ZEXT1632(_local_610),ZEXT1632(_local_610));
                  uStack_3bc = (local_710.context)->instID[0];
                  local_3c0 = uStack_3bc;
                  uStack_3b8 = uStack_3bc;
                  uStack_3b4 = uStack_3bc;
                  uStack_3b0 = (local_710.context)->instPrimID[0];
                  uStack_3ac = uStack_3b0;
                  uStack_3a8 = uStack_3b0;
                  uStack_3a4 = uStack_3b0;
                  local_710.valid = (int *)local_7a0;
                  local_710.geometryUserPtr = pGVar71->userPtr;
                  local_710.hit = (RTCHitN *)&local_430;
                  local_710.N = 4;
                  local_7a0 = auVar140;
                  local_710.ray = (RTCRayN *)ray;
                  if (pGVar71->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar165 = ZEXT1664(auVar158);
                    auVar204 = ZEXT1664(auVar204._0_16_);
                    (*pGVar71->intersectionFilterN)(&local_710);
                    pGVar71 = (Geometry *)local_760._0_8_;
                  }
                  if (local_7a0 == (undefined1  [16])0x0) {
                    auVar138 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar139 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
                    auVar138 = auVar138 ^ auVar139;
                  }
                  else {
                    p_Var7 = context->args->filter;
                    auVar139 = vpcmpeqd_avx(auVar138,auVar138);
                    if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar71->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar165 = ZEXT1664(auVar165._0_16_);
                      auVar204 = ZEXT1664(auVar204._0_16_);
                      (*p_Var7)(&local_710);
                      auVar139 = vpcmpeqd_avx(auVar139,auVar139);
                      pGVar71 = (Geometry *)local_760._0_8_;
                    }
                    auVar8 = vpcmpeqd_avx(local_7a0,_DAT_01f45a50);
                    auVar138 = auVar8 ^ auVar139;
                    if (local_7a0 != (undefined1  [16])0x0) {
                      auVar8 = auVar8 ^ auVar139;
                      auVar139 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])local_710.hit);
                      *(undefined1 (*) [16])(local_710.ray + 0xc0) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])(local_710.hit + 0x10))
                      ;
                      *(undefined1 (*) [16])(local_710.ray + 0xd0) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])(local_710.hit + 0x20))
                      ;
                      *(undefined1 (*) [16])(local_710.ray + 0xe0) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])(local_710.hit + 0x30))
                      ;
                      *(undefined1 (*) [16])(local_710.ray + 0xf0) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])(local_710.hit + 0x40))
                      ;
                      *(undefined1 (*) [16])(local_710.ray + 0x100) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])(local_710.hit + 0x50))
                      ;
                      *(undefined1 (*) [16])(local_710.ray + 0x110) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])(local_710.hit + 0x60))
                      ;
                      *(undefined1 (*) [16])(local_710.ray + 0x120) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])(local_710.hit + 0x70))
                      ;
                      *(undefined1 (*) [16])(local_710.ray + 0x130) = auVar139;
                      auVar139 = vmaskmovps_avx(auVar8,*(undefined1 (*) [16])(local_710.hit + 0x80))
                      ;
                      *(undefined1 (*) [16])(local_710.ray + 0x140) = auVar139;
                    }
                  }
                  auVar160 = local_380;
                  auVar104._8_8_ = 0x100000001;
                  auVar104._0_8_ = 0x100000001;
                  if ((auVar104 & auVar138) == (undefined1  [16])0x0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_840._0_4_;
                  }
                  else {
                    local_840._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_840._4_4_ = 0;
                    local_840._8_4_ = 0;
                    local_840._12_4_ = 0;
                  }
                  *(undefined4 *)(local_520 + uVar69 * 4) = 0;
                  local_840._16_16_ = auVar106._16_16_;
                  auVar92._4_4_ = local_840._0_4_;
                  auVar92._0_4_ = local_840._0_4_;
                  auVar92._8_4_ = local_840._0_4_;
                  auVar92._12_4_ = local_840._0_4_;
                  auVar92._16_4_ = local_840._0_4_;
                  auVar92._20_4_ = local_840._0_4_;
                  auVar92._24_4_ = local_840._0_4_;
                  auVar92._28_4_ = local_840._0_4_;
                  auVar164 = vcmpps_avx(auVar160,auVar92,2);
                  auVar106 = vandps_avx(auVar164,local_520);
                  local_520 = local_520 & auVar164;
                  if ((((((((local_520 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_520 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_520 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_520 >> 0x7f,0) == '\0') &&
                        (local_520 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_520 >> 0xbf,0) == '\0') &&
                      (local_520 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_520[0x1f]) break;
                  auVar117._8_4_ = 0x7f800000;
                  auVar117._0_8_ = 0x7f8000007f800000;
                  auVar117._12_4_ = 0x7f800000;
                  auVar117._16_4_ = 0x7f800000;
                  auVar117._20_4_ = 0x7f800000;
                  auVar117._24_4_ = 0x7f800000;
                  auVar117._28_4_ = 0x7f800000;
                  auVar160 = vblendvps_avx(auVar117,auVar160,auVar106);
                  auVar164 = vshufps_avx(auVar160,auVar160,0xb1);
                  auVar164 = vminps_avx(auVar160,auVar164);
                  auVar132 = vshufpd_avx(auVar164,auVar164,5);
                  auVar164 = vminps_avx(auVar164,auVar132);
                  auVar132 = vpermpd_avx2(auVar164,0x4e);
                  auVar164 = vminps_avx(auVar164,auVar132);
                  auVar164 = vcmpps_avx(auVar160,auVar164,0);
                  auVar132 = auVar106 & auVar164;
                  auVar160 = auVar106;
                  if ((((((((auVar132 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar132 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar132 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar132 >> 0x7f,0) != '\0') ||
                        (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar132 >> 0xbf,0) != '\0') ||
                      (auVar132 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar132[0x1f] < '\0') {
                    auVar160 = vandps_avx(auVar164,auVar106);
                  }
                  uVar65 = vmovmskps_avx(auVar160);
                  uVar68 = 0;
                  for (; (uVar65 & 1) == 0; uVar65 = uVar65 >> 1 | 0x80000000) {
                    uVar68 = uVar68 + 1;
                  }
                  uVar69 = (ulong)uVar68;
                  local_520 = auVar106;
                }
                auVar192 = ZEXT3264(local_6a0);
                auVar202 = ZEXT3264(local_780);
                auVar179 = ZEXT3264(local_660);
                pre = local_790;
              }
            }
            auVar119 = ZEXT3264(local_640);
            auVar150 = ZEXT3264(CONCAT428(fStack_5c4,
                                          CONCAT424(fStack_5c8,
                                                    CONCAT420(fStack_5cc,
                                                              CONCAT416(fStack_5d0,
                                                                        CONCAT412(fStack_5d4,
                                                                                  CONCAT48(
                                                  fStack_5d8,CONCAT44(fStack_5dc,local_5e0))))))));
            fVar120 = (float)local_5c0;
            fVar94 = local_5c0._4_4_;
            fVar95 = (float)uStack_5b8;
            fVar96 = uStack_5b8._4_4_;
            fVar97 = (float)uStack_5b0;
            fVar98 = uStack_5b0._4_4_;
            fVar99 = (float)uStack_5a8;
            uVar72 = uStack_5a8._4_4_;
          }
        }
LAB_0114f361:
        auVar143 = ZEXT3264(local_540);
      }
    }
    uVar72 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar81._4_4_ = uVar72;
    auVar81._0_4_ = uVar72;
    auVar81._8_4_ = uVar72;
    auVar81._12_4_ = uVar72;
    auVar140 = vcmpps_avx(local_240,auVar81,2);
    uVar68 = vmovmskps_avx(auVar140);
    uVar66 = (ulong)((uint)uVar66 & (uint)uVar66 + 0xf & uVar68);
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }